

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::sse2::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::sse2::ArrayIntersectorK_1<4,_embree::sse2::QuadMiIntersectorKPluecker<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  uint *puVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  int iVar13;
  int iVar14;
  size_t sVar15;
  ulong uVar16;
  float **ppfVar17;
  float *pfVar18;
  float *pfVar19;
  float *pfVar20;
  float *pfVar21;
  Geometry *pGVar22;
  long lVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  StackItemT<embree::NodeRefPtr<4>_> *pSVar28;
  uint uVar29;
  int iVar30;
  undefined4 uVar31;
  long lVar32;
  RTCFilterFunctionN p_Var33;
  RTCRayN *pRVar34;
  long lVar35;
  undefined4 uVar36;
  Scene *pSVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar41;
  uint *puVar42;
  ulong uVar43;
  size_t sVar44;
  uint uVar45;
  uint uVar46;
  uint uVar47;
  uint uVar48;
  uint uVar49;
  uint uVar50;
  uint uVar51;
  uint uVar52;
  uint uVar53;
  uint uVar54;
  uint uVar55;
  uint uVar56;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar60;
  undefined1 auVar61 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar70;
  undefined1 auVar71 [16];
  float fVar72;
  float fVar92;
  float fVar93;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  float fVar94;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar103;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  float fVar108;
  float fVar119;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar130;
  float fVar134;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar135;
  float fVar136;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  float fVar140;
  undefined1 auVar139 [16];
  float fVar141;
  float fVar148;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  float fVar149;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar160;
  float fVar161;
  float fVar162;
  undefined1 auVar159 [16];
  float fVar163;
  float fVar166;
  float fVar167;
  float fVar168;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  float fVar173;
  float fVar174;
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  undefined1 auVar175 [16];
  float fVar180;
  float fVar181;
  float fVar182;
  float fVar183;
  float fVar184;
  float fVar185;
  float fVar186;
  float fVar187;
  undefined1 auVar188 [16];
  float fVar189;
  float fVar190;
  float fVar191;
  float fVar192;
  float fVar193;
  undefined4 local_13c8;
  float fStack_13c4;
  float local_13b8;
  float fStack_13b4;
  float fStack_13b0;
  float fStack_13ac;
  vbool<4> valid;
  uint local_1378;
  uint uStack_1374;
  uint uStack_1370;
  uint uStack_136c;
  undefined8 local_1368;
  undefined8 uStack_1360;
  BVH *local_1358;
  Scene *scene;
  RTCFilterFunctionNArguments args;
  float fStack_1300;
  float fStack_12fc;
  vfloat<4> tNear;
  uint local_1278 [4];
  uint local_1268 [4];
  float local_1258 [4];
  float local_1248 [4];
  float local_1238 [4];
  undefined1 local_1228 [8];
  float fStack_1220;
  float fStack_121c;
  undefined1 local_1218 [16];
  undefined1 local_1208 [16];
  float local_11f8;
  float fStack_11f4;
  float fStack_11f0;
  float fStack_11ec;
  undefined1 local_11e8 [8];
  float fStack_11e0;
  float fStack_11dc;
  float local_11d8;
  float fStack_11d4;
  float fStack_11d0;
  float fStack_11cc;
  undefined8 local_11c8;
  float fStack_11c0;
  float fStack_11bc;
  undefined8 local_11b8;
  float fStack_11b0;
  float fStack_11ac;
  float local_11a8;
  float fStack_11a4;
  float fStack_11a0;
  float fStack_119c;
  undefined8 local_1198;
  float fStack_1190;
  float fStack_118c;
  undefined8 local_1188;
  ulong local_1180;
  ulong local_1178;
  ulong local_1170;
  ulong local_1168;
  long local_1160;
  float local_1158;
  float fStack_1154;
  float fStack_1150;
  float fStack_114c;
  float local_1148;
  float fStack_1144;
  float fStack_1140;
  float fStack_113c;
  undefined1 local_1138 [8];
  float fStack_1130;
  float fStack_112c;
  undefined1 local_1128 [8];
  float fStack_1120;
  float fStack_111c;
  undefined1 local_1118 [16];
  uint local_1108;
  uint uStack_1104;
  uint uStack_1100;
  uint uStack_10fc;
  uint local_10f8;
  uint uStack_10f4;
  uint uStack_10f0;
  uint uStack_10ec;
  undefined1 local_10e8 [16];
  undefined1 local_10d8 [16];
  uint local_10c8;
  uint uStack_10c4;
  uint uStack_10c0;
  uint uStack_10bc;
  uint local_10b8;
  uint uStack_10b4;
  uint uStack_10b0;
  uint uStack_10ac;
  float local_10a8;
  float fStack_10a4;
  float fStack_10a0;
  float fStack_109c;
  float local_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  float local_1088;
  float fStack_1084;
  float fStack_1080;
  float fStack_107c;
  float local_1078;
  float fStack_1074;
  float fStack_1070;
  float fStack_106c;
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  undefined1 local_1038 [16];
  undefined1 local_1028 [16];
  undefined1 local_1018 [16];
  undefined1 local_1008 [16];
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  undefined1 local_fe8 [16];
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  float local_f88;
  float fStack_f84;
  float fStack_f80;
  float fStack_f7c;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  
  pSVar41 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  local_1048 = *(float *)((long)&(tray->org).field_0 + k * 4);
  local_1058 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_1068 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_1078 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_1088 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  local_1098 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_1148 = local_1078 * 0.99999964;
  local_1158 = local_1088 * 0.99999964;
  local_10a8 = local_1098 * 0.99999964;
  local_1078 = local_1078 * 1.0000004;
  local_1088 = local_1088 * 1.0000004;
  local_1098 = local_1098 * 1.0000004;
  uVar38 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_1188 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  local_1168 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_1170 = uVar38 ^ 0x10;
  local_1178 = local_1188 ^ 0x10;
  local_1180 = local_1168 ^ 0x10;
  iVar30 = (tray->tnear).field_0.i[k];
  local_1208._4_4_ = iVar30;
  local_1208._0_4_ = iVar30;
  local_1208._8_4_ = iVar30;
  local_1208._12_4_ = iVar30;
  iVar30 = (tray->tfar).field_0.i[k];
  auVar171._4_4_ = iVar30;
  auVar171._0_4_ = iVar30;
  auVar171._8_4_ = iVar30;
  auVar171._12_4_ = iVar30;
  auVar170._8_4_ = 0xffffffff;
  auVar170._0_8_ = 0xffffffffffffffff;
  auVar170._12_4_ = 0xffffffff;
  local_1008 = mm_lookupmask_ps._0_16_;
  local_1028 = mm_lookupmask_ps._0_16_ ^ auVar170;
  lVar35 = (long)(1 << ((byte)k & 0x1f)) * 0x10;
  local_1018 = mm_lookupmask_ps._240_16_;
  local_1038 = mm_lookupmask_ps._240_16_ ^ auVar170;
  fStack_1044 = local_1048;
  fStack_1040 = local_1048;
  fStack_103c = local_1048;
  fStack_1054 = local_1058;
  fStack_1050 = local_1058;
  fStack_104c = local_1058;
  fStack_1064 = local_1068;
  fStack_1060 = local_1068;
  fStack_105c = local_1068;
  fStack_1074 = local_1078;
  fStack_1070 = local_1078;
  fStack_106c = local_1078;
  fStack_1084 = local_1088;
  fStack_1080 = local_1088;
  fStack_107c = local_1088;
  fStack_1094 = local_1098;
  fStack_1090 = local_1098;
  fStack_108c = local_1098;
  fStack_10a4 = local_10a8;
  fStack_10a0 = local_10a8;
  fStack_109c = local_10a8;
  fStack_1144 = local_1148;
  fStack_1140 = local_1148;
  fStack_113c = local_1148;
  fStack_1154 = local_1158;
  fStack_1150 = local_1158;
  fStack_114c = local_1158;
  uVar40 = local_1188;
  auVar170 = local_1208;
  fVar149 = local_1148;
  fVar179 = local_1148;
  fVar183 = local_1148;
  fVar140 = local_1148;
  fVar121 = local_1158;
  fVar131 = local_1158;
  fVar174 = local_1158;
  fVar122 = local_1158;
  fVar123 = local_1048;
  fVar177 = local_1048;
  fVar132 = local_1048;
  fVar133 = local_1048;
  fVar136 = local_1058;
  fVar141 = local_1058;
  fVar72 = local_1058;
  fVar92 = local_1058;
  fVar93 = local_1068;
  fVar94 = local_1068;
  fVar108 = local_1068;
  fVar119 = local_1068;
  fVar120 = local_1078;
  fVar130 = local_1078;
  fVar134 = local_1078;
  fVar135 = local_1078;
  fVar148 = local_1088;
  fVar150 = local_1088;
  fVar151 = local_1088;
  fVar152 = local_1088;
  fVar153 = local_1098;
  fVar154 = local_1098;
  fVar155 = local_1098;
  fVar156 = local_1098;
  fVar157 = local_10a8;
  fVar158 = local_10a8;
  fVar160 = local_10a8;
  fVar161 = local_10a8;
  do {
    do {
      do {
        if (pSVar41 == stack) {
          return;
        }
        pSVar28 = pSVar41 + -1;
        pSVar41 = pSVar41 + -1;
      } while (*(float *)(ray + k * 4 + 0x80) <= (float)pSVar28->dist &&
               (float)pSVar28->dist != *(float *)(ray + k * 4 + 0x80));
      sVar44 = (pSVar41->ptr).ptr;
      do {
        if ((sVar44 & 8) == 0) {
          pfVar12 = (float *)(sVar44 + 0x20 + uVar38);
          auVar73._0_4_ = (*pfVar12 - fVar123) * fVar149;
          auVar73._4_4_ = (pfVar12[1] - fVar177) * fVar179;
          auVar73._8_4_ = (pfVar12[2] - fVar132) * fVar183;
          auVar73._12_4_ = (pfVar12[3] - fVar133) * fVar140;
          pfVar12 = (float *)(sVar44 + 0x20 + uVar40);
          auVar111._0_4_ = (*pfVar12 - fVar136) * fVar121;
          auVar111._4_4_ = (pfVar12[1] - fVar141) * fVar131;
          auVar111._8_4_ = (pfVar12[2] - fVar72) * fVar174;
          auVar111._12_4_ = (pfVar12[3] - fVar92) * fVar122;
          auVar73 = maxps(auVar73,auVar111);
          pfVar12 = (float *)(sVar44 + 0x20 + local_1168);
          auVar127._0_4_ = (*pfVar12 - fVar93) * fVar157;
          auVar127._4_4_ = (pfVar12[1] - fVar94) * fVar158;
          auVar127._8_4_ = (pfVar12[2] - fVar108) * fVar160;
          auVar127._12_4_ = (pfVar12[3] - fVar119) * fVar161;
          auVar95 = maxps(auVar127,auVar170);
          tNear.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)maxps(auVar73,auVar95);
          pfVar12 = (float *)(sVar44 + 0x20 + local_1170);
          auVar138._0_4_ = (*pfVar12 - fVar123) * fVar120;
          auVar138._4_4_ = (pfVar12[1] - fVar177) * fVar130;
          auVar138._8_4_ = (pfVar12[2] - fVar132) * fVar134;
          auVar138._12_4_ = (pfVar12[3] - fVar133) * fVar135;
          pfVar12 = (float *)(sVar44 + 0x20 + local_1178);
          auVar143._0_4_ = (*pfVar12 - fVar136) * fVar148;
          auVar143._4_4_ = (pfVar12[1] - fVar141) * fVar150;
          auVar143._8_4_ = (pfVar12[2] - fVar72) * fVar151;
          auVar143._12_4_ = (pfVar12[3] - fVar92) * fVar152;
          auVar73 = minps(auVar138,auVar143);
          pfVar12 = (float *)(sVar44 + 0x20 + local_1180);
          auVar109._0_4_ = (*pfVar12 - fVar93) * fVar153;
          auVar109._4_4_ = (pfVar12[1] - fVar94) * fVar154;
          auVar109._8_4_ = (pfVar12[2] - fVar108) * fVar155;
          auVar109._12_4_ = (pfVar12[3] - fVar119) * fVar156;
          auVar95 = minps(auVar109,auVar171);
          auVar73 = minps(auVar73,auVar95);
          auVar95._4_4_ = -(uint)(tNear.field_0._4_4_ <= auVar73._4_4_);
          auVar95._0_4_ = -(uint)(tNear.field_0._0_4_ <= auVar73._0_4_);
          auVar95._8_4_ = -(uint)(tNear.field_0._8_4_ <= auVar73._8_4_);
          auVar95._12_4_ = -(uint)(tNear.field_0._12_4_ <= auVar73._12_4_);
          uVar36 = movmskps((int)bvh,auVar95);
          bvh = (BVH *)CONCAT44((int)((ulong)bvh >> 0x20),uVar36);
        }
        if ((sVar44 & 8) == 0) {
          if (bvh == (BVH *)0x0) {
            iVar30 = 4;
          }
          else {
            uVar43 = sVar44 & 0xfffffffffffffff0;
            lVar23 = 0;
            if (bvh != (BVH *)0x0) {
              for (; ((ulong)bvh >> lVar23 & 1) == 0; lVar23 = lVar23 + 1) {
              }
            }
            iVar30 = 0;
            sVar44 = *(size_t *)(uVar43 + lVar23 * 8);
            uVar39 = (ulong)&bvh[-1].field_0x23f & (ulong)bvh;
            if (uVar39 != 0) {
              uVar29 = tNear.field_0.i[lVar23];
              lVar23 = 0;
              if (uVar39 != 0) {
                for (; (uVar39 >> lVar23 & 1) == 0; lVar23 = lVar23 + 1) {
                }
              }
              sVar15 = *(size_t *)(uVar43 + lVar23 * 8);
              uVar45 = tNear.field_0.i[lVar23];
              uVar39 = uVar39 - 1 & uVar39;
              if (uVar39 == 0) {
                if (uVar29 < uVar45) {
                  (pSVar41->ptr).ptr = sVar15;
                  pSVar41->dist = uVar45;
                  pSVar41 = pSVar41 + 1;
                }
                else {
                  (pSVar41->ptr).ptr = sVar44;
                  pSVar41->dist = uVar29;
                  pSVar41 = pSVar41 + 1;
                  sVar44 = sVar15;
                }
              }
              else {
                auVar74._8_4_ = uVar29;
                auVar74._0_8_ = sVar44;
                auVar74._12_4_ = 0;
                auVar96._8_4_ = uVar45;
                auVar96._0_8_ = sVar15;
                auVar96._12_4_ = 0;
                lVar23 = 0;
                if (uVar39 != 0) {
                  for (; (uVar39 >> lVar23 & 1) == 0; lVar23 = lVar23 + 1) {
                  }
                }
                uVar16 = *(ulong *)(uVar43 + lVar23 * 8);
                iVar13 = tNear.field_0.i[lVar23];
                auVar110._8_4_ = iVar13;
                auVar110._0_8_ = uVar16;
                auVar110._12_4_ = 0;
                auVar124._8_4_ = -(uint)((int)uVar29 < (int)uVar45);
                uVar39 = uVar39 - 1 & uVar39;
                auVar170 = local_1208;
                if (uVar39 == 0) {
                  auVar124._4_4_ = auVar124._8_4_;
                  auVar124._0_4_ = auVar124._8_4_;
                  auVar124._12_4_ = auVar124._8_4_;
                  auVar73 = auVar74 & auVar124 | ~auVar124 & auVar96;
                  auVar95 = auVar96 & auVar124 | ~auVar124 & auVar74;
                  auVar125._8_4_ = -(uint)(auVar73._8_4_ < iVar13);
                  auVar125._0_8_ = CONCAT44(auVar125._8_4_,auVar125._8_4_);
                  auVar125._12_4_ = auVar125._8_4_;
                  auVar111 = auVar110 & auVar125 | ~auVar125 & auVar73;
                  auVar75._8_4_ = -(uint)(auVar95._8_4_ < auVar111._8_4_);
                  auVar75._4_4_ = auVar75._8_4_;
                  auVar75._0_4_ = auVar75._8_4_;
                  auVar75._12_4_ = auVar75._8_4_;
                  *pSVar41 = (StackItemT<embree::NodeRefPtr<4>_>)
                             (~auVar75 & auVar95 | auVar111 & auVar75);
                  pSVar41[1] = (StackItemT<embree::NodeRefPtr<4>_>)
                               (auVar95 & auVar75 | ~auVar75 & auVar111);
                  pSVar41 = pSVar41 + 2;
                  sVar44 = ~auVar125._0_8_ & uVar16 | auVar73._0_8_ & auVar125._0_8_;
                }
                else {
                  lVar23 = 0;
                  if (uVar39 != 0) {
                    for (; (uVar39 >> lVar23 & 1) == 0; lVar23 = lVar23 + 1) {
                    }
                  }
                  iVar14 = tNear.field_0.i[lVar23];
                  auVar137._8_4_ = iVar14;
                  auVar137._0_8_ = *(undefined8 *)(uVar43 + lVar23 * 8);
                  auVar137._12_4_ = 0;
                  auVar126._4_4_ = auVar124._8_4_;
                  auVar126._0_4_ = auVar124._8_4_;
                  auVar126._8_4_ = auVar124._8_4_;
                  auVar126._12_4_ = auVar124._8_4_;
                  auVar73 = auVar74 & auVar126 | ~auVar126 & auVar96;
                  auVar95 = auVar96 & auVar126 | ~auVar126 & auVar74;
                  auVar142._0_4_ = -(uint)(iVar13 < iVar14);
                  auVar142._4_4_ = -(uint)(iVar13 < iVar14);
                  auVar142._8_4_ = -(uint)(iVar13 < iVar14);
                  auVar142._12_4_ = -(uint)(iVar13 < iVar14);
                  auVar127 = auVar110 & auVar142 | ~auVar142 & auVar137;
                  auVar143 = ~auVar142 & auVar110 | auVar137 & auVar142;
                  auVar112._8_4_ = -(uint)(auVar95._8_4_ < auVar143._8_4_);
                  auVar112._4_4_ = auVar112._8_4_;
                  auVar112._0_4_ = auVar112._8_4_;
                  auVar112._12_4_ = auVar112._8_4_;
                  auVar138 = auVar95 & auVar112 | ~auVar112 & auVar143;
                  auVar97._8_4_ = -(uint)(auVar73._8_4_ < auVar127._8_4_);
                  auVar97._0_8_ = CONCAT44(auVar97._8_4_,auVar97._8_4_);
                  auVar97._12_4_ = auVar97._8_4_;
                  auVar111 = ~auVar97 & auVar73 | auVar127 & auVar97;
                  auVar76._8_4_ = -(uint)(auVar111._8_4_ < auVar138._8_4_);
                  auVar76._4_4_ = auVar76._8_4_;
                  auVar76._0_4_ = auVar76._8_4_;
                  auVar76._12_4_ = auVar76._8_4_;
                  *pSVar41 = (StackItemT<embree::NodeRefPtr<4>_>)
                             (~auVar112 & auVar95 | auVar143 & auVar112);
                  pSVar41[1] = (StackItemT<embree::NodeRefPtr<4>_>)
                               (~auVar76 & auVar111 | auVar138 & auVar76);
                  pSVar41[2] = (StackItemT<embree::NodeRefPtr<4>_>)
                               (auVar111 & auVar76 | ~auVar76 & auVar138);
                  pSVar41 = pSVar41 + 3;
                  sVar44 = auVar73._0_8_ & auVar97._0_8_ | ~auVar97._0_8_ & auVar127._0_8_;
                  fVar149 = local_1148;
                  fVar179 = fStack_1144;
                  fVar183 = fStack_1140;
                  fVar140 = fStack_113c;
                  fVar121 = local_1158;
                  fVar131 = fStack_1154;
                  fVar174 = fStack_1150;
                  fVar122 = fStack_114c;
                }
              }
            }
          }
        }
        else {
          iVar30 = 6;
        }
      } while (iVar30 == 0);
    } while (iVar30 != 6);
    uVar40 = (ulong)((uint)sVar44 & 0xf);
    if (uVar40 != 8) {
      local_1160 = 0;
      local_1358 = bvh;
      do {
        auVar170 = _local_11e8;
        lVar32 = local_1160 * 0x60;
        pSVar37 = context->scene;
        puVar1 = (uint *)((sVar44 & 0xfffffffffffffff0) + lVar32);
        puVar42 = puVar1 + 0x10;
        ppfVar17 = (pSVar37->vertices).items;
        pfVar18 = ppfVar17[*puVar42];
        pfVar12 = pfVar18 + *puVar1;
        pfVar2 = pfVar18 + puVar1[4];
        fVar174 = (pfVar18 + puVar1[8])[2];
        pfVar3 = pfVar18 + puVar1[0xc];
        fVar122 = pfVar3[1];
        fVar123 = pfVar3[2];
        pfVar19 = ppfVar17[puVar1[0x11]];
        pfVar4 = pfVar19 + puVar1[1];
        pfVar5 = pfVar19 + puVar1[5];
        fVar177 = (pfVar19 + puVar1[9])[2];
        pfVar6 = pfVar19 + puVar1[0xd];
        fVar132 = pfVar6[1];
        fVar133 = pfVar6[2];
        pfVar20 = ppfVar17[puVar1[0x12]];
        pfVar7 = pfVar20 + puVar1[2];
        pfVar8 = pfVar20 + puVar1[6];
        uVar24 = *(undefined8 *)(pfVar20 + puVar1[0xe]);
        uVar25 = *(undefined8 *)(pfVar20 + puVar1[0xe] + 2);
        pfVar21 = ppfVar17[puVar1[0x13]];
        pfVar9 = pfVar21 + puVar1[3];
        pfVar10 = pfVar21 + puVar1[7];
        pfVar11 = pfVar21 + puVar1[0xf];
        fVar136 = pfVar11[1];
        local_13c8 = (undefined4)*(undefined8 *)(pfVar21 + puVar1[0xb]);
        fStack_13c4 = (float)((ulong)*(undefined8 *)(pfVar21 + puVar1[0xb]) >> 0x20);
        local_1198 = CONCAT44(pfVar19[puVar1[9]],pfVar18[puVar1[8]]);
        local_1188 = CONCAT44(local_13c8,pfVar20[puVar1[10]]);
        fStack_11a0 = (pfVar20 + puVar1[10])[1];
        fStack_119c = fStack_13c4;
        local_13b8 = (float)uVar24;
        fStack_13b4 = (float)((ulong)uVar24 >> 0x20);
        fStack_13b0 = (float)uVar25;
        local_11e8._4_4_ = *pfVar6;
        local_11e8._0_4_ = *pfVar3;
        fVar149 = *(float *)(ray + k * 4);
        fVar179 = *(float *)(ray + k * 4 + 0x10);
        fVar163 = *pfVar12 - fVar149;
        fVar166 = *pfVar4 - fVar149;
        fVar167 = *pfVar7 - fVar149;
        fVar168 = *pfVar9 - fVar149;
        local_f88 = pfVar12[1] - fVar179;
        fStack_f84 = pfVar4[1] - fVar179;
        fStack_f80 = pfVar7[1] - fVar179;
        fStack_f7c = pfVar9[1] - fVar179;
        local_11c8 = CONCAT44(*pfVar5,*pfVar2);
        fVar150 = *pfVar2 - fVar149;
        fVar152 = *pfVar5 - fVar149;
        fVar154 = *pfVar8 - fVar149;
        fVar156 = *pfVar10 - fVar149;
        _fStack_11e0 = auVar170._8_8_;
        fVar141 = *pfVar3 - fVar149;
        fVar148 = *pfVar6 - fVar149;
        local_13b8 = local_13b8 - fVar149;
        fVar149 = *pfVar11 - fVar149;
        local_11d8 = pfVar2[1];
        fStack_11d4 = pfVar5[1];
        fStack_11d0 = pfVar8[1];
        fStack_11cc = pfVar10[1];
        local_11f8 = pfVar2[1] - fVar179;
        fStack_11f4 = pfVar5[1] - fVar179;
        fStack_11f0 = pfVar8[1] - fVar179;
        fStack_11ec = pfVar10[1] - fVar179;
        fVar173 = fVar122 - fVar179;
        fVar176 = fVar132 - fVar179;
        fVar178 = fStack_13b4 - fVar179;
        fVar179 = fVar136 - fVar179;
        fVar183 = *(float *)(ray + k * 4 + 0x20);
        fVar189 = pfVar12[2] - fVar183;
        fVar190 = pfVar4[2] - fVar183;
        fVar191 = pfVar7[2] - fVar183;
        fVar193 = pfVar9[2] - fVar183;
        local_11b8 = CONCAT44(pfVar5[2],pfVar2[2]);
        local_11a8 = pfVar8[2];
        fStack_11a4 = pfVar10[2];
        fVar184 = pfVar2[2] - fVar183;
        fVar185 = pfVar5[2] - fVar183;
        fVar186 = pfVar8[2] - fVar183;
        fVar187 = pfVar10[2] - fVar183;
        fVar180 = fVar123 - fVar183;
        fVar181 = fVar133 - fVar183;
        fVar182 = fStack_13b0 - fVar183;
        fVar183 = pfVar11[2] - fVar183;
        local_f98 = fVar141 - fVar163;
        fStack_f94 = fVar148 - fVar166;
        fStack_f90 = local_13b8 - fVar167;
        fStack_f8c = fVar149 - fVar168;
        local_fb8 = fVar173 - local_f88;
        fStack_fb4 = fVar176 - fStack_f84;
        fStack_fb0 = fVar178 - fStack_f80;
        fStack_fac = fVar179 - fStack_f7c;
        local_fa8 = fVar180 - fVar189;
        fStack_fa4 = fVar181 - fVar190;
        fStack_fa0 = fVar182 - fVar191;
        fStack_f9c = fVar183 - fVar193;
        fVar140 = *(float *)(ray + k * 4 + 0x50);
        fVar121 = *(float *)(ray + k * 4 + 0x60);
        fVar131 = *(float *)(ray + k * 4 + 0x40);
        fVar108 = (local_fb8 * (fVar180 + fVar189) - (fVar173 + local_f88) * local_fa8) * fVar131 +
                  ((fVar141 + fVar163) * local_fa8 - (fVar180 + fVar189) * local_f98) * fVar140 +
                  (local_f98 * (fVar173 + local_f88) - (fVar141 + fVar163) * local_fb8) * fVar121;
        fVar119 = (fStack_fb4 * (fVar181 + fVar190) - (fVar176 + fStack_f84) * fStack_fa4) * fVar131
                  + ((fVar148 + fVar166) * fStack_fa4 - (fVar181 + fVar190) * fStack_f94) * fVar140
                    + (fStack_f94 * (fVar176 + fStack_f84) - (fVar148 + fVar166) * fStack_fb4) *
                      fVar121;
        tNear.field_0._0_8_ = CONCAT44(fVar119,fVar108);
        tNear.field_0._8_4_ =
             (fStack_fb0 * (fVar182 + fVar191) - (fVar178 + fStack_f80) * fStack_fa0) * fVar131 +
             ((local_13b8 + fVar167) * fStack_fa0 - (fVar182 + fVar191) * fStack_f90) * fVar140 +
             (fStack_f90 * (fVar178 + fStack_f80) - (local_13b8 + fVar167) * fStack_fb0) * fVar121;
        tNear.field_0._12_4_ =
             (fStack_fac * (fVar183 + fVar193) - (fVar179 + fStack_f7c) * fStack_f9c) * fVar131 +
             ((fVar149 + fVar168) * fStack_f9c - (fVar183 + fVar193) * fStack_f8c) * fVar140 +
             (fStack_f8c * (fVar179 + fStack_f7c) - (fVar149 + fVar168) * fStack_fac) * fVar121;
        local_fd8 = fVar163 - fVar150;
        fStack_fd4 = fVar166 - fVar152;
        fStack_fd0 = fVar167 - fVar154;
        fStack_fcc = fVar168 - fVar156;
        fVar151 = local_f88 - local_11f8;
        fVar153 = fStack_f84 - fStack_11f4;
        fVar155 = fStack_f80 - fStack_11f0;
        fVar157 = fStack_f7c - fStack_11ec;
        local_fc8 = fVar189 - fVar184;
        fStack_fc4 = fVar190 - fVar185;
        fStack_fc0 = fVar191 - fVar186;
        fStack_fbc = fVar193 - fVar187;
        local_fe8._0_4_ =
             (fVar151 * (fVar189 + fVar184) - (local_f88 + local_11f8) * local_fc8) * fVar131 +
             ((fVar163 + fVar150) * local_fc8 - (fVar189 + fVar184) * local_fd8) * fVar140 +
             (local_fd8 * (local_f88 + local_11f8) - (fVar163 + fVar150) * fVar151) * fVar121;
        local_fe8._4_4_ =
             (fVar153 * (fVar190 + fVar185) - (fStack_f84 + fStack_11f4) * fStack_fc4) * fVar131 +
             ((fVar166 + fVar152) * fStack_fc4 - (fVar190 + fVar185) * fStack_fd4) * fVar140 +
             (fStack_fd4 * (fStack_f84 + fStack_11f4) - (fVar166 + fVar152) * fVar153) * fVar121;
        local_fe8._8_4_ =
             (fVar155 * (fVar191 + fVar186) - (fStack_f80 + fStack_11f0) * fStack_fc0) * fVar131 +
             ((fVar167 + fVar154) * fStack_fc0 - (fVar191 + fVar186) * fStack_fd0) * fVar140 +
             (fStack_fd0 * (fStack_f80 + fStack_11f0) - (fVar167 + fVar154) * fVar155) * fVar121;
        local_fe8._12_4_ =
             (fVar157 * (fVar193 + fVar187) - (fStack_f7c + fStack_11ec) * fStack_fbc) * fVar131 +
             ((fVar168 + fVar156) * fStack_fbc - (fVar193 + fVar187) * fStack_fcc) * fVar140 +
             (fStack_fcc * (fStack_f7c + fStack_11ec) - (fVar168 + fVar156) * fVar157) * fVar121;
        fVar72 = fVar150 - fVar141;
        fVar92 = fVar152 - fVar148;
        fVar93 = fVar154 - local_13b8;
        fVar94 = fVar156 - fVar149;
        fVar120 = local_11f8 - fVar173;
        fVar130 = fStack_11f4 - fVar176;
        fVar134 = fStack_11f0 - fVar178;
        fVar135 = fStack_11ec - fVar179;
        fVar158 = fVar184 - fVar180;
        fVar160 = fVar185 - fVar181;
        fVar161 = fVar186 - fVar182;
        fVar162 = fVar187 - fVar183;
        auVar57._0_4_ =
             (fVar120 * (fVar180 + fVar184) - (fVar173 + local_11f8) * fVar158) * fVar131 +
             ((fVar141 + fVar150) * fVar158 - (fVar180 + fVar184) * fVar72) * fVar140 +
             (fVar72 * (fVar173 + local_11f8) - (fVar141 + fVar150) * fVar120) * fVar121;
        auVar57._4_4_ =
             (fVar130 * (fVar181 + fVar185) - (fVar176 + fStack_11f4) * fVar160) * fVar131 +
             ((fVar148 + fVar152) * fVar160 - (fVar181 + fVar185) * fVar92) * fVar140 +
             (fVar92 * (fVar176 + fStack_11f4) - (fVar148 + fVar152) * fVar130) * fVar121;
        auVar57._8_4_ =
             (fVar134 * (fVar182 + fVar186) - (fVar178 + fStack_11f0) * fVar161) * fVar131 +
             ((local_13b8 + fVar154) * fVar161 - (fVar182 + fVar186) * fVar93) * fVar140 +
             (fVar93 * (fVar178 + fStack_11f0) - (local_13b8 + fVar154) * fVar134) * fVar121;
        auVar57._12_4_ =
             (fVar135 * (fVar183 + fVar187) - (fVar179 + fStack_11ec) * fVar162) * fVar131 +
             ((fVar149 + fVar156) * fVar162 - (fVar183 + fVar187) * fVar94) * fVar140 +
             (fVar94 * (fVar179 + fStack_11ec) - (fVar149 + fVar156) * fVar135) * fVar121;
        local_ff8 = fVar108 + local_fe8._0_4_ + auVar57._0_4_;
        fStack_ff4 = fVar119 + local_fe8._4_4_ + auVar57._4_4_;
        fStack_ff0 = tNear.field_0._8_4_ + local_fe8._8_4_ + auVar57._8_4_;
        fStack_fec = tNear.field_0._12_4_ + local_fe8._12_4_ + auVar57._12_4_;
        auVar169._8_4_ = tNear.field_0._8_4_;
        auVar169._0_8_ = tNear.field_0._0_8_;
        auVar169._12_4_ = tNear.field_0._12_4_;
        auVar170 = minps(auVar169,local_fe8);
        auVar171 = minps(auVar170,auVar57);
        auVar144._8_4_ = tNear.field_0._8_4_;
        auVar144._0_8_ = tNear.field_0._0_8_;
        auVar144._12_4_ = tNear.field_0._12_4_;
        auVar170 = maxps(auVar144,local_fe8);
        auVar170 = maxps(auVar170,auVar57);
        fVar149 = ABS(local_ff8) * 1.1920929e-07;
        fVar179 = ABS(fStack_ff4) * 1.1920929e-07;
        fVar183 = ABS(fStack_ff0) * 1.1920929e-07;
        fVar141 = ABS(fStack_fec) * 1.1920929e-07;
        auVar145._4_4_ = -(uint)(auVar170._4_4_ <= fVar179);
        auVar145._0_4_ = -(uint)(auVar170._0_4_ <= fVar149);
        auVar145._8_4_ = -(uint)(auVar170._8_4_ <= fVar183);
        auVar145._12_4_ = -(uint)(auVar170._12_4_ <= fVar141);
        auVar172._4_4_ = -(uint)(-fVar179 <= auVar171._4_4_);
        auVar172._0_4_ = -(uint)(-fVar149 <= auVar171._0_4_);
        auVar172._8_4_ = -(uint)(-fVar183 <= auVar171._8_4_);
        auVar172._12_4_ = -(uint)(-fVar141 <= auVar171._12_4_);
        auVar145 = auVar145 | auVar172;
        lVar23 = (sVar44 & 0xfffffffffffffff0) + lVar32;
        uVar36 = (undefined4)((ulong)lVar32 >> 0x20);
        uVar29 = movmskps((int)lVar32,auVar145);
        scene = pSVar37;
        if (uVar29 != 0) {
          local_11f8 = fVar131;
          fStack_11f4 = fVar131;
          fStack_11f0 = fVar131;
          fStack_11ec = fVar131;
          uVar45 = -(uint)(ABS(fVar120 * local_fc8) <= ABS(fVar151 * local_fa8));
          uVar48 = -(uint)(ABS(fVar130 * fStack_fc4) <= ABS(fVar153 * fStack_fa4));
          uVar51 = -(uint)(ABS(fVar134 * fStack_fc0) <= ABS(fVar155 * fStack_fa0));
          uVar54 = -(uint)(ABS(fVar135 * fStack_fbc) <= ABS(fVar157 * fStack_f9c));
          uVar46 = -(uint)(ABS(local_fd8 * fVar158) <= ABS(local_f98 * local_fc8));
          uVar49 = -(uint)(ABS(fStack_fd4 * fVar160) <= ABS(fStack_f94 * fStack_fc4));
          uVar52 = -(uint)(ABS(fStack_fd0 * fVar161) <= ABS(fStack_f90 * fStack_fc0));
          uVar55 = -(uint)(ABS(fStack_fcc * fVar162) <= ABS(fStack_f8c * fStack_fbc));
          uVar47 = -(uint)(ABS(fVar72 * fVar151) <= ABS(local_fd8 * local_fb8));
          uVar50 = -(uint)(ABS(fVar92 * fVar153) <= ABS(fStack_fd4 * fStack_fb4));
          uVar53 = -(uint)(ABS(fVar93 * fVar155) <= ABS(fStack_fd0 * fStack_fb0));
          uVar56 = -(uint)(ABS(fVar94 * fVar157) <= ABS(fStack_fcc * fStack_fac));
          local_1248[0] =
               (float)(~uVar45 & (uint)(local_fb8 * local_fc8 - fVar151 * local_fa8) |
                      (uint)(fVar151 * fVar158 - fVar120 * local_fc8) & uVar45);
          local_1248[1] =
               (float)(~uVar48 & (uint)(fStack_fb4 * fStack_fc4 - fVar153 * fStack_fa4) |
                      (uint)(fVar153 * fVar160 - fVar130 * fStack_fc4) & uVar48);
          local_1248[2] =
               (float)(~uVar51 & (uint)(fStack_fb0 * fStack_fc0 - fVar155 * fStack_fa0) |
                      (uint)(fVar155 * fVar161 - fVar134 * fStack_fc0) & uVar51);
          local_1248[3] =
               (float)(~uVar54 & (uint)(fStack_fac * fStack_fbc - fVar157 * fStack_f9c) |
                      (uint)(fVar157 * fVar162 - fVar135 * fStack_fbc) & uVar54);
          local_1238[0] =
               (float)(~uVar46 & (uint)(local_fa8 * local_fd8 - local_f98 * local_fc8) |
                      (uint)(fVar72 * local_fc8 - local_fd8 * fVar158) & uVar46);
          local_1238[1] =
               (float)(~uVar49 & (uint)(fStack_fa4 * fStack_fd4 - fStack_f94 * fStack_fc4) |
                      (uint)(fVar92 * fStack_fc4 - fStack_fd4 * fVar160) & uVar49);
          local_1238[2] =
               (float)(~uVar52 & (uint)(fStack_fa0 * fStack_fd0 - fStack_f90 * fStack_fc0) |
                      (uint)(fVar93 * fStack_fc0 - fStack_fd0 * fVar161) & uVar52);
          local_1238[3] =
               (float)(~uVar55 & (uint)(fStack_f9c * fStack_fcc - fStack_f8c * fStack_fbc) |
                      (uint)(fVar94 * fStack_fbc - fStack_fcc * fVar162) & uVar55);
          local_1228._0_4_ =
               ~uVar47 & (uint)(local_f98 * fVar151 - local_fd8 * local_fb8) |
               (uint)(local_fd8 * fVar120 - fVar72 * fVar151) & uVar47;
          local_1228._4_4_ =
               ~uVar50 & (uint)(fStack_f94 * fVar153 - fStack_fd4 * fStack_fb4) |
               (uint)(fStack_fd4 * fVar130 - fVar92 * fVar153) & uVar50;
          fStack_1220 = (float)(~uVar53 & (uint)(fStack_f90 * fVar155 - fStack_fd0 * fStack_fb0) |
                               (uint)(fStack_fd0 * fVar134 - fVar93 * fVar155) & uVar53);
          fStack_121c = (float)(~uVar56 & (uint)(fStack_f8c * fVar157 - fStack_fcc * fStack_fac) |
                               (uint)(fStack_fcc * fVar135 - fVar94 * fVar157) & uVar56);
          fVar149 = fVar131 * local_1248[0] +
                    fVar140 * local_1238[0] + fVar121 * (float)local_1228._0_4_;
          fVar179 = fVar131 * local_1248[1] +
                    fVar140 * local_1238[1] + fVar121 * (float)local_1228._4_4_;
          fVar183 = fVar131 * local_1248[2] + fVar140 * local_1238[2] + fVar121 * fStack_1220;
          fVar140 = fVar131 * local_1248[3] + fVar140 * local_1238[3] + fVar121 * fStack_121c;
          auVar139._0_4_ = fVar149 + fVar149;
          auVar139._4_4_ = fVar179 + fVar179;
          auVar139._8_4_ = fVar183 + fVar183;
          auVar139._12_4_ = fVar140 + fVar140;
          auVar58._0_4_ = fVar189 * (float)local_1228._0_4_;
          auVar58._4_4_ = fVar190 * (float)local_1228._4_4_;
          auVar58._8_4_ = fVar191 * fStack_1220;
          auVar58._12_4_ = fVar193 * fStack_121c;
          fVar121 = fVar163 * local_1248[0] + local_f88 * local_1238[0] + auVar58._0_4_;
          fVar131 = fVar166 * local_1248[1] + fStack_f84 * local_1238[1] + auVar58._4_4_;
          fVar141 = fVar167 * local_1248[2] + fStack_f80 * local_1238[2] + auVar58._8_4_;
          fVar72 = fVar168 * local_1248[3] + fStack_f7c * local_1238[3] + auVar58._12_4_;
          auVar170 = rcpps(auVar58,auVar139);
          fVar149 = auVar170._0_4_;
          fVar179 = auVar170._4_4_;
          fVar183 = auVar170._8_4_;
          fVar140 = auVar170._12_4_;
          fVar121 = ((1.0 - auVar139._0_4_ * fVar149) * fVar149 + fVar149) * (fVar121 + fVar121);
          fVar131 = ((1.0 - auVar139._4_4_ * fVar179) * fVar179 + fVar179) * (fVar131 + fVar131);
          fVar183 = ((1.0 - auVar139._8_4_ * fVar183) * fVar183 + fVar183) * (fVar141 + fVar141);
          fVar140 = ((1.0 - auVar139._12_4_ * fVar140) * fVar140 + fVar140) * (fVar72 + fVar72);
          fVar149 = *(float *)(ray + k * 4 + 0x80);
          fVar179 = *(float *)(ray + k * 4 + 0x30);
          auVar77._4_4_ = -(uint)(fVar179 <= fVar131);
          auVar77._0_4_ = -(uint)(fVar179 <= fVar121);
          auVar77._8_4_ = -(uint)(fVar179 <= fVar183);
          auVar77._12_4_ = -(uint)(fVar179 <= fVar140);
          auVar59._0_4_ = -(uint)(fVar121 <= fVar149 && fVar179 <= fVar121) & auVar145._0_4_;
          auVar59._4_4_ = -(uint)(fVar131 <= fVar149 && fVar179 <= fVar131) & auVar145._4_4_;
          auVar59._8_4_ = -(uint)(fVar183 <= fVar149 && fVar179 <= fVar183) & auVar145._8_4_;
          auVar59._12_4_ = -(uint)(fVar140 <= fVar149 && fVar179 <= fVar140) & auVar145._12_4_;
          uVar29 = movmskps(uVar29,auVar59);
          if (uVar29 != 0) {
            valid.field_0.i[0] = auVar59._0_4_ & -(uint)(auVar139._0_4_ != 0.0);
            valid.field_0.i[1] = auVar59._4_4_ & -(uint)(auVar139._4_4_ != 0.0);
            valid.field_0.i[2] = auVar59._8_4_ & -(uint)(auVar139._8_4_ != 0.0);
            valid.field_0.i[3] = auVar59._12_4_ & -(uint)(auVar139._12_4_ != 0.0);
            uVar29 = movmskps(uVar29,(undefined1  [16])valid.field_0);
            if (uVar29 != 0) {
              auVar27._4_4_ = fStack_ff4;
              auVar27._0_4_ = local_ff8;
              auVar27._8_4_ = fStack_ff0;
              auVar27._12_4_ = fStack_fec;
              local_1258[0] = fVar121;
              local_1258[1] = fVar131;
              local_1258[2] = fVar183;
              local_1258[3] = fVar140;
              local_1218 = local_1008;
              auVar170 = rcpps(auVar77,auVar27);
              fVar149 = auVar170._0_4_;
              fVar179 = auVar170._4_4_;
              fVar141 = auVar170._8_4_;
              fVar72 = auVar170._12_4_;
              fVar94 = DAT_01feca10._4_4_;
              fVar120 = DAT_01feca10._12_4_;
              fVar92 = (float)DAT_01feca10;
              fVar93 = DAT_01feca10._8_4_;
              fVar149 = (float)(-(uint)(1e-18 <= ABS(local_ff8)) &
                               (uint)((fVar92 - local_ff8 * fVar149) * fVar149 + fVar149));
              fVar179 = (float)(-(uint)(1e-18 <= ABS(fStack_ff4)) &
                               (uint)((fVar94 - fStack_ff4 * fVar179) * fVar179 + fVar179));
              fVar141 = (float)(-(uint)(1e-18 <= ABS(fStack_ff0)) &
                               (uint)((fVar93 - fStack_ff0 * fVar141) * fVar141 + fVar141));
              fVar72 = (float)(-(uint)(1e-18 <= ABS(fStack_fec)) &
                              (uint)((fVar120 - fStack_fec * fVar72) * fVar72 + fVar72));
              auVar113._0_4_ = fVar108 * fVar149;
              auVar113._4_4_ = fVar119 * fVar179;
              auVar113._8_4_ = tNear.field_0._8_4_ * fVar141;
              auVar113._12_4_ = tNear.field_0._12_4_ * fVar72;
              auVar170 = minps(auVar113,_DAT_01feca10);
              auVar175._0_4_ = fVar149 * local_fe8._0_4_;
              auVar175._4_4_ = fVar179 * local_fe8._4_4_;
              auVar175._8_4_ = fVar141 * local_fe8._8_4_;
              auVar175._12_4_ = fVar72 * local_fe8._12_4_;
              auVar171 = minps(auVar175,_DAT_01feca10);
              local_1278[0] =
                   (uint)auVar170._0_4_ & local_1028._0_4_ |
                   (uint)(fVar92 - auVar170._0_4_) & local_1008._0_4_;
              local_1278[1] =
                   (uint)auVar170._4_4_ & local_1028._4_4_ |
                   (uint)(fVar94 - auVar170._4_4_) & local_1008._4_4_;
              local_1278[2] =
                   (uint)auVar170._8_4_ & local_1028._8_4_ |
                   (uint)(fVar93 - auVar170._8_4_) & local_1008._8_4_;
              local_1278[3] =
                   (uint)auVar170._12_4_ & local_1028._12_4_ |
                   (uint)(fVar120 - auVar170._12_4_) & local_1008._12_4_;
              local_1268[0] =
                   (uint)auVar171._0_4_ & local_1028._0_4_ |
                   (uint)(fVar92 - auVar171._0_4_) & local_1008._0_4_;
              local_1268[1] =
                   (uint)auVar171._4_4_ & local_1028._4_4_ |
                   (uint)(fVar94 - auVar171._4_4_) & local_1008._4_4_;
              local_1268[2] =
                   (uint)auVar171._8_4_ & local_1028._8_4_ |
                   (uint)(fVar93 - auVar171._8_4_) & local_1008._8_4_;
              local_1268[3] =
                   (uint)auVar171._12_4_ & local_1028._12_4_ |
                   (uint)(fVar120 - auVar171._12_4_) & local_1008._12_4_;
              auVar78._0_4_ = (uint)fVar121 & valid.field_0.i[0];
              auVar78._4_4_ = (uint)fVar131 & valid.field_0.i[1];
              auVar78._8_4_ = (uint)fVar183 & valid.field_0.i[2];
              auVar78._12_4_ = (uint)fVar140 & valid.field_0.i[3];
              auVar98._0_8_ = CONCAT44(~valid.field_0.i[1],~valid.field_0.i[0]) & 0x7f8000007f800000
              ;
              auVar98._8_4_ = ~valid.field_0.i[2] & 0x7f800000;
              auVar98._12_4_ = ~valid.field_0.i[3] & 0x7f800000;
              auVar98 = auVar98 | auVar78;
              auVar114._4_4_ = auVar98._0_4_;
              auVar114._0_4_ = auVar98._4_4_;
              auVar114._8_4_ = auVar98._12_4_;
              auVar114._12_4_ = auVar98._8_4_;
              auVar170 = minps(auVar114,auVar98);
              auVar79._0_8_ = auVar170._8_8_;
              auVar79._8_4_ = auVar170._0_4_;
              auVar79._12_4_ = auVar170._4_4_;
              auVar170 = minps(auVar79,auVar170);
              auVar80._0_8_ =
                   CONCAT44(-(uint)(auVar170._4_4_ == auVar98._4_4_) & valid.field_0.i[1],
                            -(uint)(auVar170._0_4_ == auVar98._0_4_) & valid.field_0.i[0]);
              auVar80._8_4_ = -(uint)(auVar170._8_4_ == auVar98._8_4_) & valid.field_0.i[2];
              auVar80._12_4_ = -(uint)(auVar170._12_4_ == auVar98._12_4_) & valid.field_0.i[3];
              iVar30 = movmskps(uVar29,auVar80);
              aVar60 = valid.field_0;
              if (iVar30 != 0) {
                aVar60.i[2] = auVar80._8_4_;
                aVar60._0_8_ = auVar80._0_8_;
                aVar60.i[3] = auVar80._12_4_;
              }
              uVar31 = movmskps(iVar30,(undefined1  [16])aVar60);
              lVar32 = 0;
              if (CONCAT44(uVar36,uVar31) != 0) {
                for (; (CONCAT44(uVar36,uVar31) >> lVar32 & 1) == 0; lVar32 = lVar32 + 1) {
                }
              }
LAB_001fd9fb:
              uVar29 = puVar42[lVar32];
              uVar43 = (ulong)uVar29;
              pGVar22 = (pSVar37->geometries).items[uVar43].ptr;
              if ((pGVar22->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                valid.field_0.v[lVar32] = 0.0;
              }
              else {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar22->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  uVar45 = local_1278[lVar32];
                  uVar46 = local_1268[lVar32];
                  *(float *)(ray + k * 4 + 0x80) = local_1258[lVar32];
                  *(float *)(ray + k * 4 + 0xc0) = local_1248[lVar32];
                  *(float *)(ray + k * 4 + 0xd0) = local_1238[lVar32];
                  *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_1228 + lVar32 * 4);
                  *(uint *)(ray + k * 4 + 0xf0) = uVar45;
                  *(uint *)(ray + k * 4 + 0x100) = uVar46;
                  *(undefined4 *)(ray + k * 4 + 0x110) = *(undefined4 *)(lVar23 + 0x50 + lVar32 * 4)
                  ;
                  *(uint *)(ray + k * 4 + 0x120) = uVar29;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  uVar29 = context->user->instPrimID[0];
                  uVar36 = 0;
                  *(uint *)(ray + k * 4 + 0x140) = uVar29;
                  goto LAB_001fdeba;
                }
                local_1108 = local_1278[lVar32];
                local_10f8 = local_1268[lVar32];
                local_1138._4_4_ = local_1248[lVar32];
                local_1128._4_4_ = local_1238[lVar32];
                local_10d8._4_4_ = uVar29;
                local_10d8._0_4_ = uVar29;
                local_10d8._8_4_ = uVar29;
                local_10d8._12_4_ = uVar29;
                uVar36 = *(undefined4 *)(lVar23 + 0x50 + lVar32 * 4);
                local_10e8._4_4_ = uVar36;
                local_10e8._0_4_ = uVar36;
                local_10e8._8_4_ = uVar36;
                local_10e8._12_4_ = uVar36;
                local_1118._4_4_ = *(undefined4 *)(local_1228 + lVar32 * 4);
                local_1138._0_4_ = local_1138._4_4_;
                fStack_1130 = (float)local_1138._4_4_;
                fStack_112c = (float)local_1138._4_4_;
                local_1128._0_4_ = local_1128._4_4_;
                fStack_1120 = (float)local_1128._4_4_;
                fStack_111c = (float)local_1128._4_4_;
                local_1118._0_4_ = local_1118._4_4_;
                local_1118._8_4_ = local_1118._4_4_;
                local_1118._12_4_ = local_1118._4_4_;
                uStack_1104 = local_1108;
                uStack_1100 = local_1108;
                uStack_10fc = local_1108;
                uStack_10f4 = local_10f8;
                uStack_10f0 = local_10f8;
                uStack_10ec = local_10f8;
                local_10c8 = context->user->instID[0];
                uStack_10c4 = local_10c8;
                uStack_10c0 = local_10c8;
                uStack_10bc = local_10c8;
                local_10b8 = context->user->instPrimID[0];
                uStack_10b4 = local_10b8;
                uStack_10b0 = local_10b8;
                uStack_10ac = local_10b8;
                uVar36 = *(undefined4 *)(ray + k * 4 + 0x80);
                *(float *)(ray + k * 4 + 0x80) = local_1258[lVar32];
                local_1368 = *(undefined8 *)(mm_lookupmask_ps + lVar35);
                uStack_1360 = *(undefined8 *)(mm_lookupmask_ps + lVar35 + 8);
                args.valid = (int *)&local_1368;
                args.geometryUserPtr = pGVar22->userPtr;
                args.context = context->user;
                args.hit = (RTCHitN *)local_1138;
                args.N = 4;
                p_Var33 = pGVar22->intersectionFilterN;
                args.ray = (RTCRayN *)ray;
                if (p_Var33 != (RTCFilterFunctionN)0x0) {
                  p_Var33 = (RTCFilterFunctionN)(*p_Var33)(&args);
                  pSVar37 = scene;
                }
                auVar61._0_4_ = -(uint)((int)local_1368 == 0);
                auVar61._4_4_ = -(uint)(local_1368._4_4_ == 0);
                auVar61._8_4_ = -(uint)((int)uStack_1360 == 0);
                auVar61._12_4_ = -(uint)(uStack_1360._4_4_ == 0);
                uVar29 = movmskps((int)p_Var33,auVar61);
                pRVar34 = (RTCRayN *)(ulong)(uVar29 ^ 0xf);
                if ((uVar29 ^ 0xf) == 0) {
                  auVar61 = auVar61 ^ _DAT_01febe20;
                }
                else {
                  p_Var33 = context->args->filter;
                  if ((p_Var33 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar22->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    p_Var33 = (RTCFilterFunctionN)(*p_Var33)(&args);
                    pSVar37 = scene;
                  }
                  auVar81._0_4_ = -(uint)((int)local_1368 == 0);
                  auVar81._4_4_ = -(uint)(local_1368._4_4_ == 0);
                  auVar81._8_4_ = -(uint)((int)uStack_1360 == 0);
                  auVar81._12_4_ = -(uint)(uStack_1360._4_4_ == 0);
                  auVar61 = auVar81 ^ _DAT_01febe20;
                  uVar29 = movmskps((int)p_Var33,auVar81);
                  pRVar34 = (RTCRayN *)(ulong)(uVar29 ^ 0xf);
                  if ((uVar29 ^ 0xf) != 0) {
                    uVar29 = *(uint *)(args.hit + 4);
                    uVar45 = *(uint *)(args.hit + 8);
                    uVar46 = *(uint *)(args.hit + 0xc);
                    *(uint *)(args.ray + 0xc0) =
                         ~auVar81._0_4_ & *(uint *)args.hit |
                         *(uint *)(args.ray + 0xc0) & auVar81._0_4_;
                    *(uint *)(args.ray + 0xc4) =
                         ~auVar81._4_4_ & uVar29 | *(uint *)(args.ray + 0xc4) & auVar81._4_4_;
                    *(uint *)(args.ray + 200) =
                         ~auVar81._8_4_ & uVar45 | *(uint *)(args.ray + 200) & auVar81._8_4_;
                    *(uint *)(args.ray + 0xcc) =
                         ~auVar81._12_4_ & uVar46 | *(uint *)(args.ray + 0xcc) & auVar81._12_4_;
                    uVar29 = *(uint *)(args.hit + 0x14);
                    uVar45 = *(uint *)(args.hit + 0x18);
                    uVar46 = *(uint *)(args.hit + 0x1c);
                    *(uint *)(args.ray + 0xd0) =
                         ~auVar81._0_4_ & *(uint *)(args.hit + 0x10) |
                         *(uint *)(args.ray + 0xd0) & auVar81._0_4_;
                    *(uint *)(args.ray + 0xd4) =
                         ~auVar81._4_4_ & uVar29 | *(uint *)(args.ray + 0xd4) & auVar81._4_4_;
                    *(uint *)(args.ray + 0xd8) =
                         ~auVar81._8_4_ & uVar45 | *(uint *)(args.ray + 0xd8) & auVar81._8_4_;
                    *(uint *)(args.ray + 0xdc) =
                         ~auVar81._12_4_ & uVar46 | *(uint *)(args.ray + 0xdc) & auVar81._12_4_;
                    *(undefined1 (*) [16])(args.ray + 0xe0) =
                         ~auVar81 & *(undefined1 (*) [16])(args.hit + 0x20) |
                         *(undefined1 (*) [16])(args.ray + 0xe0) & auVar81;
                    *(undefined1 (*) [16])(args.ray + 0xf0) =
                         ~auVar81 & *(undefined1 (*) [16])(args.hit + 0x30) |
                         *(undefined1 (*) [16])(args.ray + 0xf0) & auVar81;
                    uVar29 = *(uint *)(args.hit + 0x44);
                    uVar45 = *(uint *)(args.hit + 0x48);
                    uVar46 = *(uint *)(args.hit + 0x4c);
                    *(uint *)(args.ray + 0x100) =
                         ~auVar81._0_4_ & *(uint *)(args.hit + 0x40) |
                         *(uint *)(args.ray + 0x100) & auVar81._0_4_;
                    *(uint *)(args.ray + 0x104) =
                         ~auVar81._4_4_ & uVar29 | *(uint *)(args.ray + 0x104) & auVar81._4_4_;
                    *(uint *)(args.ray + 0x108) =
                         ~auVar81._8_4_ & uVar45 | *(uint *)(args.ray + 0x108) & auVar81._8_4_;
                    *(uint *)(args.ray + 0x10c) =
                         ~auVar81._12_4_ & uVar46 | *(uint *)(args.ray + 0x10c) & auVar81._12_4_;
                    uVar29 = *(uint *)(args.hit + 0x54);
                    uVar45 = *(uint *)(args.hit + 0x58);
                    uVar46 = *(uint *)(args.hit + 0x5c);
                    *(uint *)(args.ray + 0x110) =
                         *(uint *)(args.ray + 0x110) & auVar81._0_4_ |
                         ~auVar81._0_4_ & *(uint *)(args.hit + 0x50);
                    *(uint *)(args.ray + 0x114) =
                         *(uint *)(args.ray + 0x114) & auVar81._4_4_ | ~auVar81._4_4_ & uVar29;
                    *(uint *)(args.ray + 0x118) =
                         *(uint *)(args.ray + 0x118) & auVar81._8_4_ | ~auVar81._8_4_ & uVar45;
                    *(uint *)(args.ray + 0x11c) =
                         *(uint *)(args.ray + 0x11c) & auVar81._12_4_ | ~auVar81._12_4_ & uVar46;
                    uVar29 = *(uint *)(args.hit + 100);
                    uVar45 = *(uint *)(args.hit + 0x68);
                    uVar46 = *(uint *)(args.hit + 0x6c);
                    *(uint *)(args.ray + 0x120) =
                         *(uint *)(args.ray + 0x120) & auVar81._0_4_ |
                         ~auVar81._0_4_ & *(uint *)(args.hit + 0x60);
                    *(uint *)(args.ray + 0x124) =
                         *(uint *)(args.ray + 0x124) & auVar81._4_4_ | ~auVar81._4_4_ & uVar29;
                    *(uint *)(args.ray + 0x128) =
                         *(uint *)(args.ray + 0x128) & auVar81._8_4_ | ~auVar81._8_4_ & uVar45;
                    *(uint *)(args.ray + 300) =
                         *(uint *)(args.ray + 300) & auVar81._12_4_ | ~auVar81._12_4_ & uVar46;
                    uVar29 = *(uint *)(args.hit + 0x74);
                    uVar45 = *(uint *)(args.hit + 0x78);
                    uVar46 = *(uint *)(args.hit + 0x7c);
                    *(uint *)(args.ray + 0x130) =
                         ~auVar81._0_4_ & *(uint *)(args.hit + 0x70) |
                         *(uint *)(args.ray + 0x130) & auVar81._0_4_;
                    *(uint *)(args.ray + 0x134) =
                         ~auVar81._4_4_ & uVar29 | *(uint *)(args.ray + 0x134) & auVar81._4_4_;
                    *(uint *)(args.ray + 0x138) =
                         ~auVar81._8_4_ & uVar45 | *(uint *)(args.ray + 0x138) & auVar81._8_4_;
                    *(uint *)(args.ray + 0x13c) =
                         ~auVar81._12_4_ & uVar46 | *(uint *)(args.ray + 0x13c) & auVar81._12_4_;
                    uVar29 = *(uint *)(args.hit + 0x84);
                    uVar45 = *(uint *)(args.hit + 0x88);
                    uVar46 = *(uint *)(args.hit + 0x8c);
                    *(uint *)(args.ray + 0x140) =
                         ~auVar81._0_4_ & *(uint *)(args.hit + 0x80) |
                         *(uint *)(args.ray + 0x140) & auVar81._0_4_;
                    *(uint *)(args.ray + 0x144) =
                         ~auVar81._4_4_ & uVar29 | *(uint *)(args.ray + 0x144) & auVar81._4_4_;
                    *(uint *)(args.ray + 0x148) =
                         ~auVar81._8_4_ & uVar45 | *(uint *)(args.ray + 0x148) & auVar81._8_4_;
                    *(uint *)(args.ray + 0x14c) =
                         ~auVar81._12_4_ & uVar46 | *(uint *)(args.ray + 0x14c) & auVar81._12_4_;
                    pRVar34 = args.ray;
                  }
                }
                auVar63._0_4_ = auVar61._0_4_ << 0x1f;
                auVar63._4_4_ = auVar61._4_4_ << 0x1f;
                auVar63._8_4_ = auVar61._8_4_ << 0x1f;
                auVar63._12_4_ = auVar61._12_4_ << 0x1f;
                iVar30 = movmskps((int)pRVar34,auVar63);
                uVar43 = CONCAT44((int)((ulong)pRVar34 >> 0x20),iVar30);
                if (iVar30 == 0) {
                  *(undefined4 *)(ray + k * 4 + 0x80) = uVar36;
                }
                valid.field_0.v[lVar32] = 0.0;
                fVar149 = *(float *)(ray + k * 4 + 0x80);
                valid.field_0.i[1] = -(uint)(fVar131 <= fVar149) & valid.field_0.i[1];
                valid.field_0.i[0] = -(uint)(fVar121 <= fVar149) & valid.field_0.i[0];
                valid.field_0.i[2] = -(uint)(fVar183 <= fVar149) & valid.field_0.i[2];
                valid.field_0.i[3] = -(uint)(fVar140 <= fVar149) & valid.field_0.i[3];
              }
              uVar45 = valid.field_0._0_4_;
              uVar46 = valid.field_0._4_4_;
              uVar47 = valid.field_0._8_4_;
              uVar48 = valid.field_0._12_4_;
              uVar36 = (undefined4)(uVar43 >> 0x20);
              uVar29 = movmskps((int)uVar43,(undefined1  [16])valid.field_0);
              if (uVar29 == 0) goto LAB_001fdeba;
              auVar82._0_4_ = uVar45 & (uint)fVar121;
              auVar82._4_4_ = uVar46 & (uint)fVar131;
              auVar82._8_4_ = uVar47 & (uint)fVar183;
              auVar82._12_4_ = uVar48 & (uint)fVar140;
              auVar99._0_8_ = CONCAT44(~uVar46,~uVar45) & 0x7f8000007f800000;
              auVar99._8_4_ = ~uVar47 & 0x7f800000;
              auVar99._12_4_ = ~uVar48 & 0x7f800000;
              auVar99 = auVar99 | auVar82;
              auVar115._4_4_ = auVar99._0_4_;
              auVar115._0_4_ = auVar99._4_4_;
              auVar115._8_4_ = auVar99._12_4_;
              auVar115._12_4_ = auVar99._8_4_;
              auVar170 = minps(auVar115,auVar99);
              auVar83._0_8_ = auVar170._8_8_;
              auVar83._8_4_ = auVar170._0_4_;
              auVar83._12_4_ = auVar170._4_4_;
              auVar170 = minps(auVar83,auVar170);
              auVar84._0_8_ =
                   CONCAT44(-(uint)(auVar170._4_4_ == auVar99._4_4_) & uVar46,
                            -(uint)(auVar170._0_4_ == auVar99._0_4_) & uVar45);
              auVar84._8_4_ = -(uint)(auVar170._8_4_ == auVar99._8_4_) & uVar47;
              auVar84._12_4_ = -(uint)(auVar170._12_4_ == auVar99._12_4_) & uVar48;
              iVar30 = movmskps(uVar29,auVar84);
              aVar62 = valid.field_0;
              if (iVar30 != 0) {
                aVar62.i[2] = auVar84._8_4_;
                aVar62._0_8_ = auVar84._0_8_;
                aVar62.i[3] = auVar84._12_4_;
              }
              uVar31 = movmskps(iVar30,(undefined1  [16])aVar62);
              lVar32 = 0;
              if (CONCAT44(uVar36,uVar31) != 0) {
                for (; (CONCAT44(uVar36,uVar31) >> lVar32 & 1) == 0; lVar32 = lVar32 + 1) {
                }
              }
              goto LAB_001fd9fb;
            }
          }
        }
LAB_001fdeba:
        fVar149 = *(float *)(ray + k * 4);
        fVar179 = *(float *)(ray + k * 4 + 0x10);
        fVar183 = *(float *)(ray + k * 4 + 0x20);
        fVar140 = *(float *)(ray + k * 4 + 0x40);
        fVar121 = *(float *)(ray + k * 4 + 0x50);
        local_1198._0_4_ = (float)local_1198 - fVar149;
        local_1198._4_4_ = local_1198._4_4_ - fVar149;
        fStack_1190 = fStack_1190 - fVar149;
        fStack_118c = fStack_118c - fVar149;
        local_11a8 = local_11a8 - fVar179;
        fStack_11a4 = fStack_11a4 - fVar179;
        fStack_11a0 = fStack_11a0 - fVar179;
        fStack_119c = fStack_119c - fVar179;
        fVar174 = fVar174 - fVar183;
        fVar177 = fVar177 - fVar183;
        fStack_1300 = fStack_1300 - fVar183;
        fStack_12fc = fStack_12fc - fVar183;
        fVar181 = (float)local_11e8._0_4_ - fVar149;
        fVar184 = (float)local_11e8._4_4_ - fVar149;
        fVar186 = fStack_11e0 - fVar149;
        fVar189 = fStack_11dc - fVar149;
        fVar122 = fVar122 - fVar179;
        fVar132 = fVar132 - fVar179;
        fStack_13b4 = fStack_13b4 - fVar179;
        fVar136 = fVar136 - fVar179;
        fStack_13ac = (float)((ulong)uVar25 >> 0x20);
        fVar123 = fVar123 - fVar183;
        fVar133 = fVar133 - fVar183;
        fStack_13b0 = fStack_13b0 - fVar183;
        fStack_13ac = fStack_13ac - fVar183;
        fVar191 = (float)local_11c8 - fVar149;
        fVar193 = local_11c8._4_4_ - fVar149;
        fVar192 = fStack_11c0 - fVar149;
        fVar149 = fStack_11bc - fVar149;
        fVar176 = local_11d8 - fVar179;
        fVar178 = fStack_11d4 - fVar179;
        fVar180 = fStack_11d0 - fVar179;
        fVar179 = fStack_11cc - fVar179;
        fVar167 = (float)local_11b8 - fVar183;
        fVar168 = local_11b8._4_4_ - fVar183;
        fVar173 = fStack_11b0 - fVar183;
        fVar183 = fStack_11ac - fVar183;
        fVar135 = fVar191 - (float)local_1198;
        fVar150 = fVar193 - local_1198._4_4_;
        fVar152 = fVar192 - fStack_1190;
        fVar154 = fVar149 - fStack_118c;
        fVar163 = fVar176 - local_11a8;
        fVar166 = fVar178 - fStack_11a4;
        fStack_11c0 = fVar180 - fStack_11a0;
        fStack_11bc = fVar179 - fStack_119c;
        fVar156 = fVar167 - fVar174;
        fVar158 = fVar168 - fVar177;
        fStack_11b0 = fVar173 - fStack_1300;
        fStack_11ac = fVar183 - fStack_12fc;
        local_11b8 = CONCAT44(fVar158,fVar156);
        fVar131 = *(float *)(ray + k * 4 + 0x60);
        local_11c8 = CONCAT44(fVar166,fVar163);
        fVar148 = (float)local_1198 - fVar181;
        fVar151 = local_1198._4_4_ - fVar184;
        fVar153 = fStack_1190 - fVar186;
        fVar155 = fStack_118c - fVar189;
        fVar157 = local_11a8 - fVar122;
        fVar160 = fStack_11a4 - fVar132;
        fVar161 = fStack_11a0 - fStack_13b4;
        fVar162 = fStack_119c - fVar136;
        fVar94 = (fVar163 * (fVar167 + fVar174) - (fVar176 + local_11a8) * fVar156) * fVar140 +
                 ((fVar191 + (float)local_1198) * fVar156 - (fVar167 + fVar174) * fVar135) * fVar121
                 + (fVar135 * (fVar176 + local_11a8) - (fVar191 + (float)local_1198) * fVar163) *
                   fVar131;
        fVar108 = (fVar166 * (fVar168 + fVar177) - (fVar178 + fStack_11a4) * fVar158) * fVar140 +
                  ((fVar193 + local_1198._4_4_) * fVar158 - (fVar168 + fVar177) * fVar150) * fVar121
                  + (fVar150 * (fVar178 + fStack_11a4) - (fVar193 + local_1198._4_4_) * fVar166) *
                    fVar131;
        tNear.field_0._0_8_ = CONCAT44(fVar108,fVar94);
        tNear.field_0._8_4_ =
             (fStack_11c0 * (fVar173 + fStack_1300) - (fVar180 + fStack_11a0) * fStack_11b0) *
             fVar140 + ((fVar192 + fStack_1190) * fStack_11b0 - (fVar173 + fStack_1300) * fVar152) *
                       fVar121 + (fVar152 * (fVar180 + fStack_11a0) -
                                 (fVar192 + fStack_1190) * fStack_11c0) * fVar131;
        tNear.field_0._12_4_ =
             (fStack_11bc * (fVar183 + fStack_12fc) - (fVar179 + fStack_119c) * fStack_11ac) *
             fVar140 + ((fVar149 + fStack_118c) * fStack_11ac - (fVar183 + fStack_12fc) * fVar154) *
                       fVar121 + (fVar154 * (fVar179 + fStack_119c) -
                                 (fVar149 + fStack_118c) * fStack_11bc) * fVar131;
        local_11d8 = fVar174 - fVar123;
        fStack_11d4 = fVar177 - fVar133;
        fStack_11d0 = fStack_1300 - fStack_13b0;
        fStack_11cc = fStack_12fc - fStack_13ac;
        local_11e8._0_4_ =
             (fVar157 * (fVar174 + fVar123) - (local_11a8 + fVar122) * local_11d8) * fVar140 +
             (((float)local_1198 + fVar181) * local_11d8 - (fVar174 + fVar123) * fVar148) * fVar121
             + (fVar148 * (local_11a8 + fVar122) - ((float)local_1198 + fVar181) * fVar157) *
               fVar131;
        local_11e8._4_4_ =
             (fVar160 * (fVar177 + fVar133) - (fStack_11a4 + fVar132) * fStack_11d4) * fVar140 +
             ((local_1198._4_4_ + fVar184) * fStack_11d4 - (fVar177 + fVar133) * fVar151) * fVar121
             + (fVar151 * (fStack_11a4 + fVar132) - (local_1198._4_4_ + fVar184) * fVar160) *
               fVar131;
        fStack_11e0 = (fVar161 * (fStack_1300 + fStack_13b0) -
                      (fStack_11a0 + fStack_13b4) * fStack_11d0) * fVar140 +
                      ((fStack_1190 + fVar186) * fStack_11d0 - (fStack_1300 + fStack_13b0) * fVar153
                      ) * fVar121 +
                      (fVar153 * (fStack_11a0 + fStack_13b4) - (fStack_1190 + fVar186) * fVar161) *
                      fVar131;
        fStack_11dc = (fVar162 * (fStack_12fc + fStack_13ac) - (fStack_119c + fVar136) * fStack_11cc
                      ) * fVar140 +
                      ((fStack_118c + fVar189) * fStack_11cc - (fStack_12fc + fStack_13ac) * fVar155
                      ) * fVar121 +
                      (fVar155 * (fStack_119c + fVar136) - (fStack_118c + fVar189) * fVar162) *
                      fVar131;
        fVar119 = fVar181 - fVar191;
        fVar120 = fVar184 - fVar193;
        fVar130 = fVar186 - fVar192;
        fVar134 = fVar189 - fVar149;
        fVar141 = fVar122 - fVar176;
        fVar72 = fVar132 - fVar178;
        fVar92 = fStack_13b4 - fVar180;
        fVar93 = fVar136 - fVar179;
        fVar182 = fVar123 - fVar167;
        fVar185 = fVar133 - fVar168;
        fVar187 = fStack_13b0 - fVar173;
        fVar190 = fStack_13ac - fVar183;
        auVar100._0_4_ =
             (fVar141 * (fVar167 + fVar123) - (fVar176 + fVar122) * fVar182) * fVar140 +
             ((fVar191 + fVar181) * fVar182 - (fVar167 + fVar123) * fVar119) * fVar121 +
             (fVar119 * (fVar176 + fVar122) - (fVar191 + fVar181) * fVar141) * fVar131;
        auVar100._4_4_ =
             (fVar72 * (fVar168 + fVar133) - (fVar178 + fVar132) * fVar185) * fVar140 +
             ((fVar193 + fVar184) * fVar185 - (fVar168 + fVar133) * fVar120) * fVar121 +
             (fVar120 * (fVar178 + fVar132) - (fVar193 + fVar184) * fVar72) * fVar131;
        auVar100._8_4_ =
             (fVar92 * (fVar173 + fStack_13b0) - (fVar180 + fStack_13b4) * fVar187) * fVar140 +
             ((fVar192 + fVar186) * fVar187 - (fVar173 + fStack_13b0) * fVar130) * fVar121 +
             (fVar130 * (fVar180 + fStack_13b4) - (fVar192 + fVar186) * fVar92) * fVar131;
        auVar100._12_4_ =
             (fVar93 * (fVar183 + fStack_13ac) - (fVar179 + fVar136) * fVar190) * fVar140 +
             ((fVar149 + fVar189) * fVar190 - (fVar183 + fStack_13ac) * fVar134) * fVar121 +
             (fVar134 * (fVar179 + fVar136) - (fVar149 + fVar189) * fVar93) * fVar131;
        fVar123 = fVar94 + (float)local_11e8._0_4_ + auVar100._0_4_;
        fVar132 = fVar108 + (float)local_11e8._4_4_ + auVar100._4_4_;
        fVar133 = tNear.field_0._8_4_ + fStack_11e0 + auVar100._8_4_;
        fVar136 = tNear.field_0._12_4_ + fStack_11dc + auVar100._12_4_;
        auVar164._8_4_ = tNear.field_0._8_4_;
        auVar164._0_8_ = tNear.field_0._0_8_;
        auVar164._12_4_ = tNear.field_0._12_4_;
        auVar170 = minps(auVar164,_local_11e8);
        auVar171 = minps(auVar170,auVar100);
        auVar128._8_4_ = tNear.field_0._8_4_;
        auVar128._0_8_ = tNear.field_0._0_8_;
        auVar128._12_4_ = tNear.field_0._12_4_;
        auVar170 = maxps(auVar128,_local_11e8);
        auVar170 = maxps(auVar170,auVar100);
        fVar149 = ABS(fVar123) * 1.1920929e-07;
        fVar179 = ABS(fVar132) * 1.1920929e-07;
        fVar183 = ABS(fVar133) * 1.1920929e-07;
        fVar122 = ABS(fVar136) * 1.1920929e-07;
        auVar129._4_4_ = -(uint)(auVar170._4_4_ <= fVar179);
        auVar129._0_4_ = -(uint)(auVar170._0_4_ <= fVar149);
        auVar129._8_4_ = -(uint)(auVar170._8_4_ <= fVar183);
        auVar129._12_4_ = -(uint)(auVar170._12_4_ <= fVar122);
        auVar165._4_4_ = -(uint)(-fVar179 <= auVar171._4_4_);
        auVar165._0_4_ = -(uint)(-fVar149 <= auVar171._0_4_);
        auVar165._8_4_ = -(uint)(-fVar183 <= auVar171._8_4_);
        auVar165._12_4_ = -(uint)(-fVar122 <= auVar171._12_4_);
        auVar129 = auVar129 | auVar165;
        iVar30 = movmskps(uVar29,auVar129);
        bvh = local_1358;
        if (iVar30 != 0) {
          uVar29 = -(uint)(ABS(fVar141 * local_11d8) <= ABS(fVar157 * fVar156));
          uVar47 = -(uint)(ABS(fVar72 * fStack_11d4) <= ABS(fVar160 * fVar158));
          uVar50 = -(uint)(ABS(fVar92 * fStack_11d0) <= ABS(fVar161 * fStack_11b0));
          uVar53 = -(uint)(ABS(fVar93 * fStack_11cc) <= ABS(fVar162 * fStack_11ac));
          uVar45 = -(uint)(ABS(fVar148 * fVar182) <= ABS(fVar135 * local_11d8));
          uVar48 = -(uint)(ABS(fVar151 * fVar185) <= ABS(fVar150 * fStack_11d4));
          uVar51 = -(uint)(ABS(fVar153 * fVar187) <= ABS(fVar152 * fStack_11d0));
          uVar54 = -(uint)(ABS(fVar155 * fVar190) <= ABS(fVar154 * fStack_11cc));
          uVar46 = -(uint)(ABS(fVar119 * fVar157) <= ABS(fVar148 * fVar163));
          uVar49 = -(uint)(ABS(fVar120 * fVar160) <= ABS(fVar151 * fVar166));
          uVar52 = -(uint)(ABS(fVar130 * fVar161) <= ABS(fVar153 * fStack_11c0));
          uVar55 = -(uint)(ABS(fVar134 * fVar162) <= ABS(fVar155 * fStack_11bc));
          local_1248[0] =
               (float)(~uVar29 & (uint)(fVar163 * local_11d8 - fVar157 * fVar156) |
                      (uint)(fVar157 * fVar182 - fVar141 * local_11d8) & uVar29);
          local_1248[1] =
               (float)(~uVar47 & (uint)(fVar166 * fStack_11d4 - fVar160 * fVar158) |
                      (uint)(fVar160 * fVar185 - fVar72 * fStack_11d4) & uVar47);
          local_1248[2] =
               (float)(~uVar50 & (uint)(fStack_11c0 * fStack_11d0 - fVar161 * fStack_11b0) |
                      (uint)(fVar161 * fVar187 - fVar92 * fStack_11d0) & uVar50);
          local_1248[3] =
               (float)(~uVar53 & (uint)(fStack_11bc * fStack_11cc - fVar162 * fStack_11ac) |
                      (uint)(fVar162 * fVar190 - fVar93 * fStack_11cc) & uVar53);
          local_1238[0] =
               (float)(~uVar45 & (uint)(fVar156 * fVar148 - fVar135 * local_11d8) |
                      (uint)(fVar119 * local_11d8 - fVar148 * fVar182) & uVar45);
          local_1238[1] =
               (float)(~uVar48 & (uint)(fVar158 * fVar151 - fVar150 * fStack_11d4) |
                      (uint)(fVar120 * fStack_11d4 - fVar151 * fVar185) & uVar48);
          local_1238[2] =
               (float)(~uVar51 & (uint)(fStack_11b0 * fVar153 - fVar152 * fStack_11d0) |
                      (uint)(fVar130 * fStack_11d0 - fVar153 * fVar187) & uVar51);
          local_1238[3] =
               (float)(~uVar54 & (uint)(fStack_11ac * fVar155 - fVar154 * fStack_11cc) |
                      (uint)(fVar134 * fStack_11cc - fVar155 * fVar190) & uVar54);
          auVar146._0_4_ = (uint)(fVar148 * fVar141 - fVar119 * fVar157) & uVar46;
          auVar146._4_4_ = (uint)(fVar151 * fVar72 - fVar120 * fVar160) & uVar49;
          auVar146._8_4_ = (uint)(fVar153 * fVar92 - fVar130 * fVar161) & uVar52;
          auVar146._12_4_ = (uint)(fVar155 * fVar93 - fVar134 * fVar162) & uVar55;
          auVar188._0_4_ = ~uVar46 & (uint)(fVar135 * fVar157 - fVar148 * fVar163);
          auVar188._4_4_ = ~uVar49 & (uint)(fVar150 * fVar160 - fVar151 * fVar166);
          auVar188._8_4_ = ~uVar52 & (uint)(fVar152 * fVar161 - fVar153 * fStack_11c0);
          auVar188._12_4_ = ~uVar55 & (uint)(fVar154 * fVar162 - fVar155 * fStack_11bc);
          _local_1228 = auVar188 | auVar146;
          fVar149 = fVar140 * local_1248[0] + fVar121 * local_1238[0] + fVar131 * local_1228._0_4_;
          fVar179 = fVar140 * local_1248[1] + fVar121 * local_1238[1] + fVar131 * local_1228._4_4_;
          fVar183 = fVar140 * local_1248[2] + fVar121 * local_1238[2] + fVar131 * local_1228._8_4_;
          fVar140 = fVar140 * local_1248[3] + fVar121 * local_1238[3] + fVar131 * local_1228._12_4_;
          auVar101._0_4_ = fVar149 + fVar149;
          auVar101._4_4_ = fVar179 + fVar179;
          auVar101._8_4_ = fVar183 + fVar183;
          auVar101._12_4_ = fVar140 + fVar140;
          auVar64._0_4_ = fVar174 * local_1228._0_4_;
          auVar64._4_4_ = fVar177 * local_1228._4_4_;
          auVar64._8_4_ = fStack_1300 * local_1228._8_4_;
          auVar64._12_4_ = fStack_12fc * local_1228._12_4_;
          fVar121 = (float)local_1198 * local_1248[0] + local_11a8 * local_1238[0] + auVar64._0_4_;
          fVar131 = local_1198._4_4_ * local_1248[1] + fStack_11a4 * local_1238[1] + auVar64._4_4_;
          fVar174 = fStack_1190 * local_1248[2] + fStack_11a0 * local_1238[2] + auVar64._8_4_;
          fVar122 = fStack_118c * local_1248[3] + fStack_119c * local_1238[3] + auVar64._12_4_;
          auVar170 = rcpps(auVar64,auVar101);
          fVar149 = auVar170._0_4_;
          fVar179 = auVar170._4_4_;
          fVar183 = auVar170._8_4_;
          fVar140 = auVar170._12_4_;
          fVar121 = ((1.0 - auVar101._0_4_ * fVar149) * fVar149 + fVar149) * (fVar121 + fVar121);
          fVar131 = ((1.0 - auVar101._4_4_ * fVar179) * fVar179 + fVar179) * (fVar131 + fVar131);
          fVar183 = ((1.0 - auVar101._8_4_ * fVar183) * fVar183 + fVar183) * (fVar174 + fVar174);
          fVar140 = ((1.0 - auVar101._12_4_ * fVar140) * fVar140 + fVar140) * (fVar122 + fVar122);
          fVar149 = *(float *)(ray + k * 4 + 0x80);
          fVar179 = *(float *)(ray + k * 4 + 0x30);
          auVar65._4_4_ = -(uint)(fVar179 <= fVar131);
          auVar65._0_4_ = -(uint)(fVar179 <= fVar121);
          auVar65._8_4_ = -(uint)(fVar179 <= fVar183);
          auVar65._12_4_ = -(uint)(fVar179 <= fVar140);
          local_1378 = auVar129._0_4_;
          uStack_1374 = auVar129._4_4_;
          uStack_1370 = auVar129._8_4_;
          uStack_136c = auVar129._12_4_;
          auVar102._0_4_ = -(uint)(fVar121 <= fVar149 && fVar179 <= fVar121) & local_1378;
          auVar102._4_4_ = -(uint)(fVar131 <= fVar149 && fVar179 <= fVar131) & uStack_1374;
          auVar102._8_4_ = -(uint)(fVar183 <= fVar149 && fVar179 <= fVar183) & uStack_1370;
          auVar102._12_4_ = -(uint)(fVar140 <= fVar149 && fVar179 <= fVar140) & uStack_136c;
          iVar30 = movmskps(iVar30,auVar102);
          if (iVar30 != 0) {
            valid.field_0.i[0] = auVar102._0_4_ & -(uint)(auVar101._0_4_ != 0.0);
            valid.field_0.i[1] = auVar102._4_4_ & -(uint)(auVar101._4_4_ != 0.0);
            valid.field_0.i[2] = auVar102._8_4_ & -(uint)(auVar101._8_4_ != 0.0);
            valid.field_0.i[3] = auVar102._12_4_ & -(uint)(auVar101._12_4_ != 0.0);
            iVar30 = movmskps(iVar30,(undefined1  [16])valid.field_0);
            if (iVar30 != 0) {
              auVar26._4_4_ = fVar132;
              auVar26._0_4_ = fVar123;
              auVar26._8_4_ = fVar133;
              auVar26._12_4_ = fVar136;
              local_1258[0] = fVar121;
              local_1258[1] = fVar131;
              local_1258[2] = fVar183;
              local_1258[3] = fVar140;
              local_1218 = local_1018;
              pSVar37 = context->scene;
              auVar170 = rcpps(auVar65,auVar26);
              fVar149 = auVar170._0_4_;
              fVar179 = auVar170._4_4_;
              fVar174 = auVar170._8_4_;
              fVar122 = auVar170._12_4_;
              fVar141 = (float)DAT_01feca10;
              fVar72 = DAT_01feca10._4_4_;
              fVar92 = DAT_01feca10._12_4_;
              fVar177 = DAT_01feca10._8_4_;
              fVar149 = (float)(-(uint)(1e-18 <= ABS(fVar123)) &
                               (uint)((fVar141 - fVar123 * fVar149) * fVar149 + fVar149));
              fVar179 = (float)(-(uint)(1e-18 <= ABS(fVar132)) &
                               (uint)((fVar72 - fVar132 * fVar179) * fVar179 + fVar179));
              fVar174 = (float)(-(uint)(1e-18 <= ABS(fVar133)) &
                               (uint)((fVar177 - fVar133 * fVar174) * fVar174 + fVar174));
              fVar122 = (float)(-(uint)(1e-18 <= ABS(fVar136)) &
                               (uint)((fVar92 - fVar136 * fVar122) * fVar122 + fVar122));
              auVar85._0_4_ = fVar94 * fVar149;
              auVar85._4_4_ = fVar108 * fVar179;
              auVar85._8_4_ = tNear.field_0._8_4_ * fVar174;
              auVar85._12_4_ = tNear.field_0._12_4_ * fVar122;
              auVar170 = minps(auVar85,_DAT_01feca10);
              auVar159._0_4_ = fVar149 * (float)local_11e8._0_4_;
              auVar159._4_4_ = fVar179 * (float)local_11e8._4_4_;
              auVar159._8_4_ = fVar174 * fStack_11e0;
              auVar159._12_4_ = fVar122 * fStack_11dc;
              auVar171 = minps(auVar159,_DAT_01feca10);
              local_1278[0] =
                   (uint)auVar170._0_4_ & local_1038._0_4_ |
                   (uint)(fVar141 - auVar170._0_4_) & local_1018._0_4_;
              local_1278[1] =
                   (uint)auVar170._4_4_ & local_1038._4_4_ |
                   (uint)(fVar72 - auVar170._4_4_) & local_1018._4_4_;
              local_1278[2] =
                   (uint)auVar170._8_4_ & local_1038._8_4_ |
                   (uint)(fVar177 - auVar170._8_4_) & local_1018._8_4_;
              local_1278[3] =
                   (uint)auVar170._12_4_ & local_1038._12_4_ |
                   (uint)(fVar92 - auVar170._12_4_) & local_1018._12_4_;
              local_1268[0] =
                   (uint)auVar171._0_4_ & local_1038._0_4_ |
                   (uint)(fVar141 - auVar171._0_4_) & local_1018._0_4_;
              local_1268[1] =
                   (uint)auVar171._4_4_ & local_1038._4_4_ |
                   (uint)(fVar72 - auVar171._4_4_) & local_1018._4_4_;
              local_1268[2] =
                   (uint)auVar171._8_4_ & local_1038._8_4_ |
                   (uint)(fVar177 - auVar171._8_4_) & local_1018._8_4_;
              local_1268[3] =
                   (uint)auVar171._12_4_ & local_1038._12_4_ |
                   (uint)(fVar92 - auVar171._12_4_) & local_1018._12_4_;
              auVar66._0_4_ = (uint)fVar121 & valid.field_0.i[0];
              auVar66._4_4_ = (uint)fVar131 & valid.field_0.i[1];
              auVar66._8_4_ = (uint)fVar183 & valid.field_0.i[2];
              auVar66._12_4_ = (uint)fVar140 & valid.field_0.i[3];
              auVar86._0_8_ = CONCAT44(~valid.field_0.i[1],~valid.field_0.i[0]) & 0x7f8000007f800000
              ;
              auVar86._8_4_ = ~valid.field_0.i[2] & 0x7f800000;
              auVar86._12_4_ = ~valid.field_0.i[3] & 0x7f800000;
              auVar86 = auVar86 | auVar66;
              auVar116._4_4_ = auVar86._0_4_;
              auVar116._0_4_ = auVar86._4_4_;
              auVar116._8_4_ = auVar86._12_4_;
              auVar116._12_4_ = auVar86._8_4_;
              auVar170 = minps(auVar116,auVar86);
              auVar67._0_8_ = auVar170._8_8_;
              auVar67._8_4_ = auVar170._0_4_;
              auVar67._12_4_ = auVar170._4_4_;
              auVar170 = minps(auVar67,auVar170);
              auVar68._0_8_ =
                   CONCAT44(-(uint)(auVar170._4_4_ == auVar86._4_4_) & valid.field_0.i[1],
                            -(uint)(auVar170._0_4_ == auVar86._0_4_) & valid.field_0.i[0]);
              auVar68._8_4_ = -(uint)(auVar170._8_4_ == auVar86._8_4_) & valid.field_0.i[2];
              auVar68._12_4_ = -(uint)(auVar170._12_4_ == auVar86._12_4_) & valid.field_0.i[3];
              iVar30 = movmskps(iVar30,auVar68);
              aVar103 = valid.field_0;
              if (iVar30 != 0) {
                aVar103.i[2] = auVar68._8_4_;
                aVar103._0_8_ = auVar68._0_8_;
                aVar103.i[3] = auVar68._12_4_;
              }
              uVar31 = movmskps(iVar30,(undefined1  [16])aVar103);
              lVar32 = 0;
              if (CONCAT44(uVar36,uVar31) != 0) {
                for (; (CONCAT44(uVar36,uVar31) >> lVar32 & 1) == 0; lVar32 = lVar32 + 1) {
                }
              }
LAB_001fe442:
              uVar29 = puVar42[lVar32];
              uVar43 = (ulong)uVar29;
              pGVar22 = (pSVar37->geometries).items[uVar43].ptr;
              if ((pGVar22->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                valid.field_0.v[lVar32] = 0.0;
              }
              else {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar22->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  uVar45 = local_1278[lVar32];
                  uVar46 = local_1268[lVar32];
                  *(float *)(ray + k * 4 + 0x80) = local_1258[lVar32];
                  *(float *)(ray + k * 4 + 0xc0) = local_1248[lVar32];
                  *(float *)(ray + k * 4 + 0xd0) = local_1238[lVar32];
                  *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_1228 + lVar32 * 4);
                  *(uint *)(ray + k * 4 + 0xf0) = uVar45;
                  *(uint *)(ray + k * 4 + 0x100) = uVar46;
                  *(undefined4 *)(ray + k * 4 + 0x110) = *(undefined4 *)(lVar23 + 0x50 + lVar32 * 4)
                  ;
                  *(uint *)(ray + k * 4 + 0x120) = uVar29;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  goto LAB_001fe924;
                }
                local_1108 = local_1278[lVar32];
                local_10f8 = local_1268[lVar32];
                fVar149 = local_1248[lVar32];
                fVar179 = local_1238[lVar32];
                local_10d8._4_4_ = uVar29;
                local_10d8._0_4_ = uVar29;
                local_10d8._8_4_ = uVar29;
                local_10d8._12_4_ = uVar29;
                uVar36 = *(undefined4 *)(lVar23 + 0x50 + lVar32 * 4);
                local_10e8._4_4_ = uVar36;
                local_10e8._0_4_ = uVar36;
                local_10e8._8_4_ = uVar36;
                local_10e8._12_4_ = uVar36;
                local_1138._4_4_ = fVar149;
                local_1138._0_4_ = fVar149;
                fStack_1130 = fVar149;
                fStack_112c = fVar149;
                local_1128._4_4_ = fVar179;
                local_1128._0_4_ = fVar179;
                fStack_1120 = fVar179;
                fStack_111c = fVar179;
                uVar36 = *(undefined4 *)(local_1228 + lVar32 * 4);
                local_1118._4_4_ = uVar36;
                local_1118._0_4_ = uVar36;
                local_1118._8_4_ = uVar36;
                local_1118._12_4_ = uVar36;
                uStack_1104 = local_1108;
                uStack_1100 = local_1108;
                uStack_10fc = local_1108;
                uStack_10f4 = local_10f8;
                uStack_10f0 = local_10f8;
                uStack_10ec = local_10f8;
                local_10c8 = context->user->instID[0];
                uStack_10c4 = local_10c8;
                uStack_10c0 = local_10c8;
                uStack_10bc = local_10c8;
                local_10b8 = context->user->instPrimID[0];
                uStack_10b4 = local_10b8;
                uStack_10b0 = local_10b8;
                uStack_10ac = local_10b8;
                uVar36 = *(undefined4 *)(ray + k * 4 + 0x80);
                *(float *)(ray + k * 4 + 0x80) = local_1258[lVar32];
                local_1368 = *(undefined8 *)(mm_lookupmask_ps + lVar35);
                uStack_1360 = *(undefined8 *)(mm_lookupmask_ps + lVar35 + 8);
                args.valid = (int *)&local_1368;
                args.geometryUserPtr = pGVar22->userPtr;
                args.context = context->user;
                args.hit = (RTCHitN *)local_1138;
                args.N = 4;
                p_Var33 = pGVar22->intersectionFilterN;
                args.ray = (RTCRayN *)ray;
                if (p_Var33 != (RTCFilterFunctionN)0x0) {
                  p_Var33 = (RTCFilterFunctionN)(*p_Var33)(&args);
                  bvh = local_1358;
                }
                auVar69._0_4_ = -(uint)((int)local_1368 == 0);
                auVar69._4_4_ = -(uint)(local_1368._4_4_ == 0);
                auVar69._8_4_ = -(uint)((int)uStack_1360 == 0);
                auVar69._12_4_ = -(uint)(uStack_1360._4_4_ == 0);
                uVar29 = movmskps((int)p_Var33,auVar69);
                pRVar34 = (RTCRayN *)(ulong)(uVar29 ^ 0xf);
                if ((uVar29 ^ 0xf) == 0) {
                  auVar69 = auVar69 ^ _DAT_01febe20;
                }
                else {
                  p_Var33 = context->args->filter;
                  if ((p_Var33 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar22->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    p_Var33 = (RTCFilterFunctionN)(*p_Var33)(&args);
                    bvh = local_1358;
                  }
                  auVar87._0_4_ = -(uint)((int)local_1368 == 0);
                  auVar87._4_4_ = -(uint)(local_1368._4_4_ == 0);
                  auVar87._8_4_ = -(uint)((int)uStack_1360 == 0);
                  auVar87._12_4_ = -(uint)(uStack_1360._4_4_ == 0);
                  auVar69 = auVar87 ^ _DAT_01febe20;
                  uVar29 = movmskps((int)p_Var33,auVar87);
                  pRVar34 = (RTCRayN *)(ulong)(uVar29 ^ 0xf);
                  if ((uVar29 ^ 0xf) != 0) {
                    auVar104._0_4_ = *(uint *)(args.ray + 0xc0) & auVar87._0_4_;
                    auVar104._4_4_ = *(uint *)(args.ray + 0xc4) & auVar87._4_4_;
                    auVar104._8_4_ = *(uint *)(args.ray + 200) & auVar87._8_4_;
                    auVar104._12_4_ = *(uint *)(args.ray + 0xcc) & auVar87._12_4_;
                    auVar147._0_4_ = ~auVar87._0_4_ & *(uint *)args.hit;
                    auVar147._4_4_ = ~auVar87._4_4_ & *(uint *)(args.hit + 4);
                    auVar147._8_4_ = ~auVar87._8_4_ & *(uint *)(args.hit + 8);
                    auVar147._12_4_ = ~auVar87._12_4_ & *(uint *)(args.hit + 0xc);
                    *(undefined1 (*) [16])(args.ray + 0xc0) = auVar147 | auVar104;
                    uVar29 = *(uint *)(args.hit + 0x14);
                    uVar45 = *(uint *)(args.hit + 0x18);
                    uVar46 = *(uint *)(args.hit + 0x1c);
                    *(uint *)(args.ray + 0xd0) =
                         ~auVar87._0_4_ & *(uint *)(args.hit + 0x10) |
                         *(uint *)(args.ray + 0xd0) & auVar87._0_4_;
                    *(uint *)(args.ray + 0xd4) =
                         ~auVar87._4_4_ & uVar29 | *(uint *)(args.ray + 0xd4) & auVar87._4_4_;
                    *(uint *)(args.ray + 0xd8) =
                         ~auVar87._8_4_ & uVar45 | *(uint *)(args.ray + 0xd8) & auVar87._8_4_;
                    *(uint *)(args.ray + 0xdc) =
                         ~auVar87._12_4_ & uVar46 | *(uint *)(args.ray + 0xdc) & auVar87._12_4_;
                    *(undefined1 (*) [16])(args.ray + 0xe0) =
                         ~auVar87 & *(undefined1 (*) [16])(args.hit + 0x20) |
                         *(undefined1 (*) [16])(args.ray + 0xe0) & auVar87;
                    *(undefined1 (*) [16])(args.ray + 0xf0) =
                         ~auVar87 & *(undefined1 (*) [16])(args.hit + 0x30) |
                         *(undefined1 (*) [16])(args.ray + 0xf0) & auVar87;
                    uVar29 = *(uint *)(args.hit + 0x44);
                    uVar45 = *(uint *)(args.hit + 0x48);
                    uVar46 = *(uint *)(args.hit + 0x4c);
                    *(uint *)(args.ray + 0x100) =
                         ~auVar87._0_4_ & *(uint *)(args.hit + 0x40) |
                         *(uint *)(args.ray + 0x100) & auVar87._0_4_;
                    *(uint *)(args.ray + 0x104) =
                         ~auVar87._4_4_ & uVar29 | *(uint *)(args.ray + 0x104) & auVar87._4_4_;
                    *(uint *)(args.ray + 0x108) =
                         ~auVar87._8_4_ & uVar45 | *(uint *)(args.ray + 0x108) & auVar87._8_4_;
                    *(uint *)(args.ray + 0x10c) =
                         ~auVar87._12_4_ & uVar46 | *(uint *)(args.ray + 0x10c) & auVar87._12_4_;
                    uVar29 = *(uint *)(args.hit + 0x54);
                    uVar45 = *(uint *)(args.hit + 0x58);
                    uVar46 = *(uint *)(args.hit + 0x5c);
                    *(uint *)(args.ray + 0x110) =
                         *(uint *)(args.ray + 0x110) & auVar87._0_4_ |
                         ~auVar87._0_4_ & *(uint *)(args.hit + 0x50);
                    *(uint *)(args.ray + 0x114) =
                         *(uint *)(args.ray + 0x114) & auVar87._4_4_ | ~auVar87._4_4_ & uVar29;
                    *(uint *)(args.ray + 0x118) =
                         *(uint *)(args.ray + 0x118) & auVar87._8_4_ | ~auVar87._8_4_ & uVar45;
                    *(uint *)(args.ray + 0x11c) =
                         *(uint *)(args.ray + 0x11c) & auVar87._12_4_ | ~auVar87._12_4_ & uVar46;
                    uVar29 = *(uint *)(args.hit + 100);
                    uVar45 = *(uint *)(args.hit + 0x68);
                    uVar46 = *(uint *)(args.hit + 0x6c);
                    *(uint *)(args.ray + 0x120) =
                         *(uint *)(args.ray + 0x120) & auVar87._0_4_ |
                         ~auVar87._0_4_ & *(uint *)(args.hit + 0x60);
                    *(uint *)(args.ray + 0x124) =
                         *(uint *)(args.ray + 0x124) & auVar87._4_4_ | ~auVar87._4_4_ & uVar29;
                    *(uint *)(args.ray + 0x128) =
                         *(uint *)(args.ray + 0x128) & auVar87._8_4_ | ~auVar87._8_4_ & uVar45;
                    *(uint *)(args.ray + 300) =
                         *(uint *)(args.ray + 300) & auVar87._12_4_ | ~auVar87._12_4_ & uVar46;
                    auVar105._0_4_ = *(uint *)(args.ray + 0x130) & auVar87._0_4_;
                    auVar105._4_4_ = *(uint *)(args.ray + 0x134) & auVar87._4_4_;
                    auVar105._8_4_ = *(uint *)(args.ray + 0x138) & auVar87._8_4_;
                    auVar105._12_4_ = *(uint *)(args.ray + 0x13c) & auVar87._12_4_;
                    auVar117._0_4_ = ~auVar87._0_4_ & *(uint *)(args.hit + 0x70);
                    auVar117._4_4_ = ~auVar87._4_4_ & *(uint *)(args.hit + 0x74);
                    auVar117._8_4_ = ~auVar87._8_4_ & *(uint *)(args.hit + 0x78);
                    auVar117._12_4_ = ~auVar87._12_4_ & *(uint *)(args.hit + 0x7c);
                    *(undefined1 (*) [16])(args.ray + 0x130) = auVar117 | auVar105;
                    auVar106._0_4_ = *(uint *)(args.ray + 0x140) & auVar87._0_4_;
                    auVar106._4_4_ = *(uint *)(args.ray + 0x144) & auVar87._4_4_;
                    auVar106._8_4_ = *(uint *)(args.ray + 0x148) & auVar87._8_4_;
                    auVar106._12_4_ = *(uint *)(args.ray + 0x14c) & auVar87._12_4_;
                    auVar88._0_4_ = ~auVar87._0_4_ & *(uint *)(args.hit + 0x80);
                    auVar88._4_4_ = ~auVar87._4_4_ & *(uint *)(args.hit + 0x84);
                    auVar88._8_4_ = ~auVar87._8_4_ & *(uint *)(args.hit + 0x88);
                    auVar88._12_4_ = ~auVar87._12_4_ & *(uint *)(args.hit + 0x8c);
                    *(undefined1 (*) [16])(args.ray + 0x140) = auVar88 | auVar106;
                    pRVar34 = args.ray;
                  }
                }
                auVar71._0_4_ = auVar69._0_4_ << 0x1f;
                auVar71._4_4_ = auVar69._4_4_ << 0x1f;
                auVar71._8_4_ = auVar69._8_4_ << 0x1f;
                auVar71._12_4_ = auVar69._12_4_ << 0x1f;
                iVar30 = movmskps((int)pRVar34,auVar71);
                uVar43 = CONCAT44((int)((ulong)pRVar34 >> 0x20),iVar30);
                if (iVar30 == 0) {
                  *(undefined4 *)(ray + k * 4 + 0x80) = uVar36;
                }
                valid.field_0.v[lVar32] = 0.0;
                fVar149 = *(float *)(ray + k * 4 + 0x80);
                valid.field_0.i[1] = -(uint)(fVar131 <= fVar149) & valid.field_0.i[1];
                valid.field_0.i[0] = -(uint)(fVar121 <= fVar149) & valid.field_0.i[0];
                valid.field_0.i[2] = -(uint)(fVar183 <= fVar149) & valid.field_0.i[2];
                valid.field_0.i[3] = -(uint)(fVar140 <= fVar149) & valid.field_0.i[3];
              }
              uVar29 = valid.field_0._0_4_;
              uVar45 = valid.field_0._4_4_;
              uVar46 = valid.field_0._8_4_;
              uVar47 = valid.field_0._12_4_;
              iVar30 = movmskps((int)uVar43,(undefined1  [16])valid.field_0);
              if (iVar30 == 0) goto LAB_001fe924;
              auVar89._0_4_ = uVar29 & (uint)fVar121;
              auVar89._4_4_ = uVar45 & (uint)fVar131;
              auVar89._8_4_ = uVar46 & (uint)fVar183;
              auVar89._12_4_ = uVar47 & (uint)fVar140;
              auVar107._0_8_ = CONCAT44(~uVar45,~uVar29) & 0x7f8000007f800000;
              auVar107._8_4_ = ~uVar46 & 0x7f800000;
              auVar107._12_4_ = ~uVar47 & 0x7f800000;
              auVar107 = auVar107 | auVar89;
              auVar118._4_4_ = auVar107._0_4_;
              auVar118._0_4_ = auVar107._4_4_;
              auVar118._8_4_ = auVar107._12_4_;
              auVar118._12_4_ = auVar107._8_4_;
              auVar170 = minps(auVar118,auVar107);
              auVar90._0_8_ = auVar170._8_8_;
              auVar90._8_4_ = auVar170._0_4_;
              auVar90._12_4_ = auVar170._4_4_;
              auVar170 = minps(auVar90,auVar170);
              auVar91._0_8_ =
                   CONCAT44(-(uint)(auVar170._4_4_ == auVar107._4_4_) & uVar45,
                            -(uint)(auVar170._0_4_ == auVar107._0_4_) & uVar29);
              auVar91._8_4_ = -(uint)(auVar170._8_4_ == auVar107._8_4_) & uVar46;
              auVar91._12_4_ = -(uint)(auVar170._12_4_ == auVar107._12_4_) & uVar47;
              iVar30 = movmskps(iVar30,auVar91);
              aVar70 = valid.field_0;
              if (iVar30 != 0) {
                aVar70.i[2] = auVar91._8_4_;
                aVar70._0_8_ = auVar91._0_8_;
                aVar70.i[3] = auVar91._12_4_;
              }
              uVar36 = movmskps(iVar30,(undefined1  [16])aVar70);
              uVar43 = CONCAT44((int)(uVar43 >> 0x20),uVar36);
              lVar32 = 0;
              if (uVar43 != 0) {
                for (; (uVar43 >> lVar32 & 1) == 0; lVar32 = lVar32 + 1) {
                }
              }
              goto LAB_001fe442;
            }
          }
        }
LAB_001fe924:
        local_1160 = local_1160 + 1;
      } while (local_1160 != uVar40 - 8);
    }
    uVar36 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar171._4_4_ = uVar36;
    auVar171._0_4_ = uVar36;
    auVar171._8_4_ = uVar36;
    auVar171._12_4_ = uVar36;
    uVar40 = local_1188;
    auVar170 = local_1208;
    fVar149 = local_1148;
    fVar179 = fStack_1144;
    fVar183 = fStack_1140;
    fVar140 = fStack_113c;
    fVar121 = local_1158;
    fVar131 = fStack_1154;
    fVar174 = fStack_1150;
    fVar122 = fStack_114c;
    fVar123 = local_1048;
    fVar177 = fStack_1044;
    fVar132 = fStack_1040;
    fVar133 = fStack_103c;
    fVar136 = local_1058;
    fVar141 = fStack_1054;
    fVar72 = fStack_1050;
    fVar92 = fStack_104c;
    fVar93 = local_1068;
    fVar94 = fStack_1064;
    fVar108 = fStack_1060;
    fVar119 = fStack_105c;
    fVar120 = local_1078;
    fVar130 = fStack_1074;
    fVar134 = fStack_1070;
    fVar135 = fStack_106c;
    fVar148 = local_1088;
    fVar150 = fStack_1084;
    fVar151 = fStack_1080;
    fVar152 = fStack_107c;
    fVar153 = local_1098;
    fVar154 = fStack_1094;
    fVar155 = fStack_1090;
    fVar156 = fStack_108c;
    fVar157 = local_10a8;
    fVar158 = fStack_10a4;
    fVar160 = fStack_10a0;
    fVar161 = fStack_109c;
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }